

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_optimal_t *pZVar1;
  ZSTD_match_t *pZVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  U32 UVar5;
  uint uVar6;
  U32 UVar7;
  U32 UVar8;
  int iVar9;
  U32 UVar10;
  U32 UVar11;
  BYTE *op;
  ulong *puVar12;
  ulong *puVar13;
  long lVar14;
  ulong uVar15;
  U32 *pUVar16;
  ZSTD_optimal_t *pZVar17;
  U32 *pUVar18;
  seqDef *psVar19;
  ulong *puVar20;
  ulong *puVar21;
  ulong uVar22;
  U32 UVar23;
  uint uVar24;
  uint uVar25;
  uint *puVar26;
  uint *puVar27;
  uint uVar28;
  ulong *puVar29;
  ulong *puVar30;
  ulong *puVar31;
  BYTE *base;
  BYTE *pBVar32;
  uint uVar33;
  undefined1 auVar34 [8];
  uint uVar35;
  U32 *pUVar36;
  optState_t *poVar37;
  ulong *puVar38;
  U32 *pUVar39;
  ulong *puVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  BYTE *pStart_3;
  ulong uVar46;
  U32 *pUVar47;
  seqStore_t *ssPtr;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  uint uVar52;
  BYTE *pStart_9;
  ulong uVar53;
  ZSTD_optimal_t *pZVar54;
  BYTE *pStart_1;
  long lVar55;
  ulong *puVar56;
  BYTE *ip;
  ulong uVar57;
  BYTE *pStart_11;
  ulong *puVar58;
  uint uVar59;
  bool bVar60;
  int iVar64;
  int iVar65;
  undefined1 auVar61 [16];
  int iVar66;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  int iVar71;
  repcodes_t rVar72;
  BYTE *pInLoopLimit;
  BYTE *pStart_8;
  U32 dummy32;
  U32 dummy32_1;
  uint *local_220;
  uint *local_218;
  uint *local_208;
  uint *local_200;
  uint *local_1f0;
  U32 *local_1e8;
  ulong local_1e0;
  ulong local_1d0;
  uint *local_1c8;
  uint *local_1c0;
  uint *local_1a8;
  U32 *local_190;
  ulong local_188;
  uint *local_180;
  uint local_15c;
  ZSTD_optimal_t *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  U32 local_138;
  ulong *local_130;
  uint *local_128;
  undefined8 local_120;
  undefined1 local_118 [8];
  int iStack_110;
  int iStack_10c;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  optState_t *local_f0;
  ulong local_e8;
  U32 *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  ulong *local_b0;
  ulong local_a8;
  ulong *local_a0;
  seqStore_t *local_98;
  undefined8 local_90;
  U32 local_88;
  ulong *local_80;
  ZSTD_optimal_t *local_78;
  undefined8 local_70;
  U32 *local_68;
  uint *local_60;
  uint local_54;
  size_t local_50;
  ulong local_48;
  U32 *local_40;
  ulong local_38;
  
  pBVar32 = (ms->window).base;
  local_130 = (ulong *)src;
  local_e0 = rep;
  local_98 = seqStore;
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (uVar59 = (ms->window).dictLimit, uVar59 == (ms->window).lowLimit)) &&
     ((0x400 < srcSize && (uVar6 = (int)src - (int)pBVar32, uVar59 == uVar6)))) {
    local_138 = rep[2];
    local_140 = *(ulong *)rep;
    local_f0 = &ms->opt;
    puVar58 = (ulong *)((long)src + (srcSize - 8));
    uVar59 = (ms->cParams).targetLength;
    if (0xffe < uVar59) {
      uVar59 = 0xfff;
    }
    local_80 = (ulong *)CONCAT44(local_80._4_4_,uVar59);
    uVar59 = (ms->cParams).minMatch;
    pZVar2 = (ms->opt).matchTable;
    local_158 = (ms->opt).priceTable;
    ms->nextToUpdate3 = ms->nextToUpdate;
    local_50 = srcSize;
    ZSTD_rescaleFreqs(local_f0,(BYTE *)src,srcSize,2);
    puVar38 = (ulong *)((ulong)((ulong *)(pBVar32 + uVar6) == local_130) + (long)local_130);
    local_a0 = puVar58;
    ssPtr = local_98;
    if (puVar38 < puVar58) {
      puVar12 = (ulong *)(local_50 + (long)local_130);
      uVar59 = (uint)(uVar59 != 3);
      uVar6 = uVar59 + 3;
      local_100 = (U32 *)(ulong)(uVar59 + 2);
      puVar58 = (ulong *)((long)puVar12 - 7);
      puVar31 = (ulong *)((long)puVar12 - 3);
      puVar13 = (ulong *)((long)puVar12 + -1);
      local_68 = local_158->rep;
      local_38 = (ulong)(uVar59 + 5 & 0xfffffffc);
      lVar14 = (ulong)uVar6 - 2;
      auVar61._8_4_ = (int)lVar14;
      auVar61._0_8_ = lVar14;
      auVar61._12_4_ = (int)((ulong)lVar14 >> 0x20);
      local_78 = local_158 + 4;
      _local_c8 = auVar61 ^ _DAT_0015c8b0;
      puVar30 = local_130;
LAB_0011b98a:
      iVar9 = (int)puVar38;
      UVar23 = iVar9 - (int)puVar30;
      pBVar32 = (ms->window).base;
      uVar59 = ms->nextToUpdate;
      uVar15 = (ulong)uVar59;
      if (pBVar32 + uVar15 <= puVar38) {
        UVar8 = (ms->cParams).minMatch;
        uVar33 = iVar9 - (int)pBVar32;
        while (uVar59 < uVar33) {
          UVar7 = ZSTD_insertBt1(ms,pBVar32 + uVar15,(BYTE *)puVar12,UVar8,0);
          uVar59 = (int)uVar15 + UVar7;
          uVar15 = (ulong)uVar59;
        }
        ms->nextToUpdate = uVar33;
        local_120._4_4_ = (undefined4)((ulong)local_120 >> 0x20);
        if (UVar8 - 6 < 2) {
          uVar15 = (ulong)(UVar23 == 0);
          uVar59 = (ms->cParams).targetLength;
          if (0xffe < uVar59) {
            uVar59 = 0xfff;
          }
          pBVar32 = (ms->window).base;
          uVar35 = iVar9 - (int)pBVar32;
          uVar57 = 0;
          uVar46 = *puVar38 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          pUVar18 = ms->chainTable;
          uVar28 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar33 = uVar35 - uVar28;
          if (uVar35 < uVar28) {
            uVar33 = 0;
          }
          UVar8 = (ms->window).lowLimit;
          local_118._0_4_ = UVar8 + (UVar8 == 0);
          uVar53 = (ulong)((uVar28 & uVar35) * 2);
          puVar27 = pUVar18 + uVar53;
          local_220 = pUVar18 + uVar53 + 1;
          UVar8 = (ms->window).dictLimit;
          pUVar39 = ms->hashTable;
          uVar44 = pUVar39[uVar46];
          iVar9 = uVar35 + 9;
          uVar51 = (ms->cParams).searchLog;
          local_120 = (U32 *)CONCAT44(local_120._4_4_,uVar51);
          uVar53 = uVar15 + 3;
          puVar20 = (ulong *)((long)puVar38 + 4);
          pUVar16 = local_100;
          do {
            uVar24 = (U32)local_140 - 1;
            if (uVar15 != 3) {
              uVar24 = *(uint *)((long)&local_140 + uVar15 * 4);
            }
            pUVar36 = (U32 *)0x0;
            if ((uVar24 - 1 < uVar35 - UVar8) &&
               ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)uVar24))) {
              lVar14 = -(ulong)uVar24;
              puVar29 = (ulong *)((long)puVar20 + lVar14);
              puVar21 = puVar20;
              if (puVar20 < puVar58) {
                if (*puVar29 == *puVar20) {
                  lVar14 = lVar14 + 0xc;
                  lVar55 = 0;
                  do {
                    puVar21 = (ulong *)((long)puVar38 + lVar55 + 0xc);
                    if (puVar58 <= puVar21) {
                      puVar29 = (ulong *)((long)puVar38 + lVar55 + lVar14);
                      goto LAB_0011befe;
                    }
                    uVar48 = *(ulong *)((long)puVar38 + lVar55 + lVar14);
                    lVar55 = lVar55 + 8;
                  } while (uVar48 == *puVar21);
                  uVar48 = *puVar21 ^ uVar48;
                  uVar22 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar24 = ((uint)(uVar22 >> 3) & 0x1fffffff) + (int)lVar55;
                }
                else {
                  uVar22 = *puVar20 ^ *puVar29;
                  uVar48 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                    }
                  }
                  uVar24 = (uint)(uVar48 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0011befe:
                if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar21 < puVar12) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                }
                uVar24 = (int)puVar21 - (int)puVar20;
              }
              pUVar36 = (U32 *)(ulong)(uVar24 + 4);
            }
            if (pUVar16 < pUVar36) {
              pZVar2[uVar57].off = (int)uVar15 - (uint)(UVar23 == 0);
              pZVar2[uVar57].len = (uint)pUVar36;
              uVar57 = (ulong)((int)uVar57 + 1);
              if ((uVar59 < (uint)pUVar36) ||
                 (pUVar16 = pUVar36, (ulong *)((long)puVar38 + (long)pUVar36) == puVar12))
              goto LAB_0011ce6c;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar53);
          pUVar39[uVar46] = uVar35;
          if ((uint)local_118._0_4_ <= uVar44) {
            uVar59 = ~(-1 << ((byte)uVar51 & 0x1f));
            pUVar39 = (U32 *)0x0;
            pUVar36 = (U32 *)0x0;
            iVar64 = iVar9;
            do {
              uVar15 = (ulong)uVar44;
              pUVar47 = pUVar36;
              if (pUVar39 < pUVar36) {
                pUVar47 = pUVar39;
              }
              puVar20 = (ulong *)((long)puVar38 + (long)pUVar47);
              puVar29 = (ulong *)(pBVar32 + uVar15 + (long)pUVar47);
              puVar21 = puVar20;
              if (puVar20 < puVar58) {
                if (*puVar29 == *puVar20) {
                  lVar14 = 0;
                  do {
                    puVar21 = (ulong *)((long)(puVar38 + 1) + (long)pUVar47 + lVar14);
                    if (puVar58 <= puVar21) {
                      puVar29 = (ulong *)(pBVar32 + (long)pUVar47 + lVar14 + 8 + uVar15);
                      goto LAB_0011c0b5;
                    }
                    lVar55 = lVar14 + uVar15 + 8;
                    lVar14 = lVar14 + 8;
                  } while (*(ulong *)(pBVar32 + (long)pUVar47 + lVar55) == *puVar21);
                  uVar53 = *puVar21 ^ *(ulong *)(pBVar32 + (long)pUVar47 + lVar55);
                  uVar46 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                    }
                  }
                  uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar14;
                }
                else {
                  uVar53 = *puVar20 ^ *puVar29;
                  uVar46 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                    }
                  }
                  uVar46 = uVar46 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0011c0b5:
                if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar21 < puVar12) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                }
                uVar46 = (long)puVar21 - (long)puVar20;
              }
              pUVar47 = (U32 *)(uVar46 + (long)pUVar47);
              iVar9 = iVar64;
              if (pUVar16 < pUVar47) {
                iVar9 = uVar44 + (U32)pUVar47;
                if (pUVar47 <= (U32 *)(ulong)(iVar64 - uVar44)) {
                  iVar9 = iVar64;
                }
                pZVar2[uVar57].off = (uVar35 + 2) - uVar44;
                pZVar2[uVar57].len = (U32)pUVar47;
                uVar57 = (ulong)((int)uVar57 + 1);
                if (((U32 *)0x1000 < pUVar47) ||
                   (pUVar16 = pUVar47, (ulong *)((long)puVar38 + (long)pUVar47) == puVar12)) break;
              }
              puVar26 = pUVar18 + (uVar44 & uVar28) * 2;
              if ((pBVar32 + uVar15)[(long)pUVar47] < *(byte *)((long)puVar38 + (long)pUVar47)) {
                *puVar27 = uVar44;
                if (uVar44 <= uVar33) goto LAB_0011cdf5;
                puVar26 = puVar26 + 1;
                puVar27 = puVar26;
                pUVar39 = pUVar47;
                pUVar47 = pUVar36;
              }
              else {
                *local_220 = uVar44;
                local_220 = puVar26;
                if (uVar44 <= uVar33) goto LAB_0011cde8;
              }
              bVar60 = uVar59 == 0;
              uVar59 = uVar59 - 1;
              if ((bVar60) ||
                 (uVar44 = *puVar26, pUVar36 = pUVar47, iVar64 = iVar9,
                 uVar44 < (uint)local_118._0_4_)) break;
            } while( true );
          }
          goto LAB_0011c467;
        }
        if (UVar8 == 5) {
          uVar15 = (ulong)(UVar23 == 0);
          uVar59 = (ms->cParams).targetLength;
          if (0xffe < uVar59) {
            uVar59 = 0xfff;
          }
          pBVar32 = (ms->window).base;
          uVar35 = iVar9 - (int)pBVar32;
          uVar57 = 0;
          uVar46 = *puVar38 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          pUVar18 = ms->chainTable;
          uVar28 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar33 = uVar35 - uVar28;
          if (uVar35 < uVar28) {
            uVar33 = 0;
          }
          UVar8 = (ms->window).lowLimit;
          local_118._0_4_ = UVar8 + (UVar8 == 0);
          uVar53 = (ulong)((uVar28 & uVar35) * 2);
          puVar27 = pUVar18 + uVar53;
          local_220 = pUVar18 + uVar53 + 1;
          UVar8 = (ms->window).dictLimit;
          pUVar39 = ms->hashTable;
          uVar44 = pUVar39[uVar46];
          iVar9 = uVar35 + 9;
          uVar51 = (ms->cParams).searchLog;
          local_120 = (U32 *)CONCAT44(local_120._4_4_,uVar51);
          uVar53 = uVar15 + 3;
          puVar20 = (ulong *)((long)puVar38 + 4);
          pUVar16 = local_100;
          do {
            uVar24 = (U32)local_140 - 1;
            if (uVar15 != 3) {
              uVar24 = *(uint *)((long)&local_140 + uVar15 * 4);
            }
            pUVar36 = (U32 *)0x0;
            if ((uVar24 - 1 < uVar35 - UVar8) &&
               ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)uVar24))) {
              lVar14 = -(ulong)uVar24;
              puVar29 = (ulong *)((long)puVar20 + lVar14);
              puVar21 = puVar20;
              if (puVar20 < puVar58) {
                if (*puVar29 == *puVar20) {
                  lVar14 = lVar14 + 0xc;
                  lVar55 = 0;
                  do {
                    puVar21 = (ulong *)((long)puVar38 + lVar55 + 0xc);
                    if (puVar58 <= puVar21) {
                      puVar29 = (ulong *)((long)puVar38 + lVar55 + lVar14);
                      goto LAB_0011c391;
                    }
                    uVar48 = *(ulong *)((long)puVar38 + lVar55 + lVar14);
                    lVar55 = lVar55 + 8;
                  } while (uVar48 == *puVar21);
                  uVar48 = *puVar21 ^ uVar48;
                  uVar22 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar24 = ((uint)(uVar22 >> 3) & 0x1fffffff) + (int)lVar55;
                }
                else {
                  uVar22 = *puVar20 ^ *puVar29;
                  uVar48 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                    }
                  }
                  uVar24 = (uint)(uVar48 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0011c391:
                if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar21 < puVar12) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                }
                uVar24 = (int)puVar21 - (int)puVar20;
              }
              pUVar36 = (U32 *)(ulong)(uVar24 + 4);
            }
            if (pUVar16 < pUVar36) {
              pZVar2[uVar57].off = (int)uVar15 - (uint)(UVar23 == 0);
              pZVar2[uVar57].len = (uint)pUVar36;
              uVar57 = (ulong)((int)uVar57 + 1);
              if ((uVar59 < (uint)pUVar36) ||
                 (pUVar16 = pUVar36, (ulong *)((long)puVar38 + (long)pUVar36) == puVar12))
              goto LAB_0011ce6c;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar53);
          pUVar39[uVar46] = uVar35;
          if ((uint)local_118._0_4_ <= uVar44) {
            uVar59 = ~(-1 << ((byte)uVar51 & 0x1f));
            pUVar39 = (U32 *)0x0;
            pUVar36 = (U32 *)0x0;
            iVar64 = iVar9;
            do {
              uVar15 = (ulong)uVar44;
              pUVar47 = pUVar36;
              if (pUVar39 < pUVar36) {
                pUVar47 = pUVar39;
              }
              puVar20 = (ulong *)((long)puVar38 + (long)pUVar47);
              puVar29 = (ulong *)(pBVar32 + uVar15 + (long)pUVar47);
              puVar21 = puVar20;
              if (puVar20 < puVar58) {
                if (*puVar29 == *puVar20) {
                  lVar14 = 0;
                  do {
                    puVar21 = (ulong *)((long)(puVar38 + 1) + (long)pUVar47 + lVar14);
                    if (puVar58 <= puVar21) {
                      puVar29 = (ulong *)(pBVar32 + (long)pUVar47 + lVar14 + 8 + uVar15);
                      goto LAB_0011c849;
                    }
                    lVar55 = lVar14 + uVar15 + 8;
                    lVar14 = lVar14 + 8;
                  } while (*(ulong *)(pBVar32 + (long)pUVar47 + lVar55) == *puVar21);
                  uVar53 = *puVar21 ^ *(ulong *)(pBVar32 + (long)pUVar47 + lVar55);
                  uVar46 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                    }
                  }
                  uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar14;
                }
                else {
                  uVar53 = *puVar20 ^ *puVar29;
                  uVar46 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                    }
                  }
                  uVar46 = uVar46 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0011c849:
                if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar21 < puVar12) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                }
                uVar46 = (long)puVar21 - (long)puVar20;
              }
              pUVar47 = (U32 *)(uVar46 + (long)pUVar47);
              iVar9 = iVar64;
              if (pUVar16 < pUVar47) {
                iVar9 = uVar44 + (U32)pUVar47;
                if (pUVar47 <= (U32 *)(ulong)(iVar64 - uVar44)) {
                  iVar9 = iVar64;
                }
                pZVar2[uVar57].off = (uVar35 + 2) - uVar44;
                pZVar2[uVar57].len = (U32)pUVar47;
                uVar57 = (ulong)((int)uVar57 + 1);
                if (((U32 *)0x1000 < pUVar47) ||
                   (pUVar16 = pUVar47, (ulong *)((long)puVar38 + (long)pUVar47) == puVar12)) break;
              }
              puVar26 = pUVar18 + (uVar44 & uVar28) * 2;
              if ((pBVar32 + uVar15)[(long)pUVar47] < *(byte *)((long)puVar38 + (long)pUVar47)) {
                *puVar27 = uVar44;
                if (uVar44 <= uVar33) goto LAB_0011cdf5;
                puVar26 = puVar26 + 1;
                puVar27 = puVar26;
                pUVar39 = pUVar47;
                pUVar47 = pUVar36;
              }
              else {
                *local_220 = uVar44;
                local_220 = puVar26;
                if (uVar44 <= uVar33) goto LAB_0011cde8;
              }
              bVar60 = uVar59 == 0;
              uVar59 = uVar59 - 1;
              if ((bVar60) ||
                 (uVar44 = *puVar26, pUVar36 = pUVar47, iVar64 = iVar9,
                 uVar44 < (uint)local_118._0_4_)) break;
            } while( true );
          }
          goto LAB_0011c467;
        }
        if (UVar8 == 3) {
          uVar15 = (ulong)(UVar23 == 0);
          uVar59 = (ms->cParams).targetLength;
          if (0xffe < uVar59) {
            uVar59 = 0xfff;
          }
          pBVar32 = (ms->window).base;
          uVar35 = iVar9 - (int)pBVar32;
          uVar57 = 0;
          uVar51 = (uint)*puVar38 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
          pUVar18 = ms->chainTable;
          uVar28 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar33 = uVar35 - uVar28;
          if (uVar35 < uVar28) {
            uVar33 = 0;
          }
          UVar8 = (ms->window).lowLimit;
          uVar24 = UVar8 + (UVar8 == 0);
          uVar46 = (ulong)((uVar28 & uVar35) * 2);
          local_1e8 = pUVar18 + uVar46;
          local_200 = pUVar18 + uVar46 + 1;
          UVar8 = (ms->window).dictLimit;
          local_120 = ms->hashTable;
          uVar44 = ms->hashTable[uVar51];
          local_118._0_4_ = uVar35 + 9;
          local_f8._4_4_ = (undefined4)((ulong)local_f8 >> 0x20);
          local_f8 = (uint *)CONCAT44(local_f8._4_4_,(ms->cParams).searchLog);
          uVar46 = uVar15 + 3;
          puVar20 = (ulong *)((long)puVar38 + 3);
          pUVar39 = local_100;
          do {
            uVar52 = (U32)local_140 - 1;
            if (uVar15 != 3) {
              uVar52 = *(uint *)((long)&local_140 + uVar15 * 4);
            }
            pUVar16 = (U32 *)0x0;
            if ((uVar52 - 1 < uVar35 - UVar8) &&
               (((*(uint *)((long)puVar38 - (ulong)uVar52) ^ (uint)*puVar38) & 0xffffff) == 0)) {
              lVar14 = -(ulong)uVar52;
              puVar29 = (ulong *)((long)puVar20 + lVar14);
              puVar21 = puVar20;
              if (puVar20 < puVar58) {
                if (*puVar29 == *puVar20) {
                  lVar14 = lVar14 + 0xb;
                  lVar55 = 0;
                  do {
                    puVar21 = (ulong *)((long)puVar38 + lVar55 + 0xb);
                    if (puVar58 <= puVar21) {
                      puVar29 = (ulong *)((long)puVar38 + lVar55 + lVar14);
                      goto LAB_0011bbf0;
                    }
                    uVar53 = *(ulong *)((long)puVar38 + lVar55 + lVar14);
                    lVar55 = lVar55 + 8;
                  } while (uVar53 == *puVar21);
                  uVar53 = *puVar21 ^ uVar53;
                  uVar48 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                    }
                  }
                  uVar52 = ((uint)(uVar48 >> 3) & 0x1fffffff) + (int)lVar55;
                }
                else {
                  uVar48 = *puVar20 ^ *puVar29;
                  uVar53 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                    }
                  }
                  uVar52 = (uint)(uVar53 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0011bbf0:
                if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar21 < puVar12) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                }
                uVar52 = (int)puVar21 - (int)puVar20;
              }
              pUVar16 = (U32 *)(ulong)(uVar52 + 3);
            }
            if (pUVar39 < pUVar16) {
              pZVar2[uVar57].off = (int)uVar15 - (uint)(UVar23 == 0);
              pZVar2[uVar57].len = (uint)pUVar16;
              uVar57 = (ulong)((int)uVar57 + 1);
              if ((uVar59 < (uint)pUVar16) ||
                 (pUVar39 = pUVar16, (ulong *)((long)puVar38 + (long)pUVar16) == puVar12))
              goto LAB_0011ce6c;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar46);
          if (((pUVar39 < (U32 *)0x3) &&
              (UVar8 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar38), uVar24 <= UVar8)) &&
             (uVar35 - UVar8 < 0x40000)) {
            uVar15 = (ulong)UVar8;
            puVar29 = (ulong *)(pBVar32 + uVar15);
            puVar20 = puVar38;
            if (puVar38 < puVar58) {
              if (*puVar29 == *puVar38) {
                lVar14 = 0;
                do {
                  puVar20 = (ulong *)((long)puVar38 + lVar14 + 8);
                  if (puVar58 <= puVar20) {
                    puVar29 = (ulong *)(pBVar32 + lVar14 + uVar15 + 8);
                    puVar20 = (ulong *)((long)puVar38 + lVar14 + 8);
                    goto LAB_0011f2cd;
                  }
                  lVar55 = lVar14 + uVar15 + 8;
                  uVar46 = *puVar20;
                  lVar14 = lVar14 + 8;
                } while (*(ulong *)(pBVar32 + lVar55) == uVar46);
                uVar46 = uVar46 ^ *(ulong *)(pBVar32 + lVar55);
                uVar15 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                pUVar16 = (U32 *)((uVar15 >> 3 & 0x1fffffff) + lVar14);
              }
              else {
                uVar46 = *puVar38 ^ *puVar29;
                uVar15 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                pUVar16 = (U32 *)(uVar15 >> 3 & 0x1fffffff);
              }
            }
            else {
LAB_0011f2cd:
              if ((puVar20 < puVar31) && ((uint)*puVar29 == (uint)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar20 < puVar13) && ((short)*puVar29 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar20 < puVar12) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar20));
              }
              pUVar16 = (U32 *)((long)puVar20 - (long)puVar38);
            }
            if (pUVar16 < (U32 *)0x3) goto LAB_0011c70f;
            pZVar2->off = (uVar35 - UVar8) + 2;
            pZVar2->len = (U32)pUVar16;
            if ((pUVar16 <= (U32 *)(ulong)uVar59) &&
               (uVar57 = 1, pUVar39 = pUVar16, (ulong *)((long)puVar38 + (long)pUVar16) != puVar12))
            goto LAB_0011c70f;
            UVar8 = uVar35 + 1;
            uVar57 = 1;
          }
          else {
LAB_0011c70f:
            local_120[uVar51] = uVar35;
            if (uVar44 < uVar24) {
              iVar9 = local_118._0_4_;
            }
            else {
              uVar59 = ~(-1 << ((byte)local_f8 & 0x1f));
              pUVar36 = (U32 *)0x0;
              pUVar16 = (U32 *)0x0;
              do {
                uVar15 = (ulong)uVar44;
                pUVar47 = pUVar16;
                if (pUVar36 < pUVar16) {
                  pUVar47 = pUVar36;
                }
                puVar20 = (ulong *)((long)puVar38 + (long)pUVar47);
                puVar29 = (ulong *)(pBVar32 + uVar15 + (long)pUVar47);
                puVar21 = puVar20;
                if (puVar20 < puVar58) {
                  if (*puVar29 == *puVar20) {
                    lVar14 = 0;
                    do {
                      puVar21 = (ulong *)((long)(puVar38 + 1) + (long)pUVar47 + lVar14);
                      if (puVar58 <= puVar21) {
                        puVar29 = (ulong *)(pBVar32 + (long)pUVar47 + lVar14 + 8 + uVar15);
                        goto LAB_0011cc8c;
                      }
                      lVar55 = lVar14 + uVar15 + 8;
                      lVar14 = lVar14 + 8;
                    } while (*(ulong *)(pBVar32 + (long)pUVar47 + lVar55) == *puVar21);
                    uVar53 = *puVar21 ^ *(ulong *)(pBVar32 + (long)pUVar47 + lVar55);
                    uVar46 = 0;
                    if (uVar53 != 0) {
                      for (; (uVar53 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar14;
                  }
                  else {
                    uVar53 = *puVar20 ^ *puVar29;
                    uVar46 = 0;
                    if (uVar53 != 0) {
                      for (; (uVar53 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                      }
                    }
                    uVar46 = uVar46 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0011cc8c:
                  if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar29 = (ulong *)((long)puVar29 + 4);
                  }
                  if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar29 = (ulong *)((long)puVar29 + 2);
                  }
                  if (puVar21 < puVar12) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                  }
                  uVar46 = (long)puVar21 - (long)puVar20;
                }
                pUVar47 = (U32 *)(uVar46 + (long)pUVar47);
                iVar9 = local_118._0_4_;
                if (pUVar39 < pUVar47) {
                  iVar9 = uVar44 + (U32)pUVar47;
                  if (pUVar47 <= (U32 *)(ulong)(local_118._0_4_ - uVar44)) {
                    iVar9 = local_118._0_4_;
                  }
                  pZVar2[uVar57].off = (uVar35 + 2) - uVar44;
                  pZVar2[uVar57].len = (U32)pUVar47;
                  uVar57 = (ulong)((int)uVar57 + 1);
                  if (((U32 *)0x1000 < pUVar47) ||
                     (pUVar39 = pUVar47, (ulong *)((long)puVar38 + (long)pUVar47) == puVar12))
                  break;
                }
                puVar27 = pUVar18 + (uVar44 & uVar28) * 2;
                if ((pBVar32 + uVar15)[(long)pUVar47] < *(byte *)((long)puVar38 + (long)pUVar47)) {
                  *local_1e8 = uVar44;
                  if (uVar44 <= uVar33) {
                    local_1e8 = &local_15c;
                    break;
                  }
                  puVar27 = puVar27 + 1;
                  pUVar36 = pUVar47;
                  local_1e8 = puVar27;
                }
                else {
                  *local_200 = uVar44;
                  pUVar16 = pUVar47;
                  local_200 = puVar27;
                  if (uVar44 <= uVar33) {
                    local_200 = &local_15c;
                    break;
                  }
                }
                bVar60 = uVar59 == 0;
                uVar59 = uVar59 - 1;
                if (bVar60) break;
                uVar44 = *puVar27;
                local_118._0_4_ = iVar9;
              } while (uVar24 <= uVar44);
            }
            *local_200 = 0;
            *local_1e8 = 0;
            UVar8 = iVar9 - 8;
          }
          ms->nextToUpdate = UVar8;
        }
        else {
          uVar15 = (ulong)(UVar23 == 0);
          uVar59 = (ms->cParams).targetLength;
          if (0xffe < uVar59) {
            uVar59 = 0xfff;
          }
          pBVar32 = (ms->window).base;
          uVar35 = iVar9 - (int)pBVar32;
          uVar57 = 0;
          uVar51 = (uint)*puVar38 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
          pUVar18 = ms->chainTable;
          uVar28 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar33 = uVar35 - uVar28;
          if (uVar35 < uVar28) {
            uVar33 = 0;
          }
          UVar8 = (ms->window).lowLimit;
          local_118._0_4_ = UVar8 + (UVar8 == 0);
          uVar46 = (ulong)((uVar28 & uVar35) * 2);
          puVar27 = pUVar18 + uVar46;
          local_220 = pUVar18 + uVar46 + 1;
          UVar8 = (ms->window).dictLimit;
          pUVar39 = ms->hashTable;
          uVar24 = pUVar39[uVar51];
          iVar9 = uVar35 + 9;
          uVar44 = (ms->cParams).searchLog;
          local_120 = (U32 *)CONCAT44(local_120._4_4_,uVar44);
          uVar46 = uVar15 + 3;
          puVar20 = (ulong *)((long)puVar38 + 4);
          pUVar16 = local_100;
          do {
            uVar52 = (U32)local_140 - 1;
            if (uVar15 != 3) {
              uVar52 = *(uint *)((long)&local_140 + uVar15 * 4);
            }
            uVar25 = 0;
            if ((uVar52 - 1 < uVar35 - UVar8) &&
               (uVar25 = 0, (uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)uVar52))) {
              lVar14 = -(ulong)uVar52;
              puVar29 = (ulong *)((long)puVar20 + lVar14);
              puVar21 = puVar20;
              if (puVar20 < puVar58) {
                if (*puVar29 == *puVar20) {
                  lVar14 = lVar14 + 0xc;
                  lVar55 = 0;
                  do {
                    puVar21 = (ulong *)((long)puVar38 + lVar55 + 0xc);
                    if (puVar58 <= puVar21) {
                      puVar29 = (ulong *)((long)puVar38 + lVar55 + lVar14);
                      goto LAB_0011c61e;
                    }
                    uVar53 = *(ulong *)((long)puVar38 + lVar55 + lVar14);
                    lVar55 = lVar55 + 8;
                  } while (uVar53 == *puVar21);
                  uVar53 = *puVar21 ^ uVar53;
                  uVar48 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                    }
                  }
                  uVar25 = ((uint)(uVar48 >> 3) & 0x1fffffff) + (int)lVar55;
                }
                else {
                  uVar48 = *puVar20 ^ *puVar29;
                  uVar53 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                    }
                  }
                  uVar25 = (uint)(uVar53 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_0011c61e:
                if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar21 < puVar12) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                }
                uVar25 = (int)puVar21 - (int)puVar20;
              }
              uVar25 = uVar25 + 4;
            }
            pUVar36 = (U32 *)(ulong)uVar25;
            if (pUVar16 < pUVar36) {
              pZVar2[uVar57].off = (int)uVar15 - (uint)(UVar23 == 0);
              pZVar2[uVar57].len = uVar25;
              uVar57 = (ulong)((int)uVar57 + 1);
              if ((uVar59 < uVar25) ||
                 (pUVar16 = pUVar36, (ulong *)((long)puVar38 + (long)pUVar36) == puVar12))
              goto LAB_0011ce6c;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar46);
          pUVar39[uVar51] = uVar35;
          if ((uint)local_118._0_4_ <= uVar24) {
            uVar59 = ~(-1 << ((byte)uVar44 & 0x1f));
            pUVar39 = (U32 *)0x0;
            pUVar36 = (U32 *)0x0;
            do {
              uVar15 = (ulong)uVar24;
              pUVar47 = pUVar36;
              if (pUVar39 < pUVar36) {
                pUVar47 = pUVar39;
              }
              puVar20 = (ulong *)((long)puVar38 + (long)pUVar47);
              puVar29 = (ulong *)(pBVar32 + uVar15 + (long)pUVar47);
              puVar21 = puVar20;
              if (puVar20 < puVar58) {
                if (*puVar29 == *puVar20) {
                  lVar14 = 0;
                  do {
                    puVar21 = (ulong *)((long)(puVar38 + 1) + (long)pUVar47 + lVar14);
                    if (puVar58 <= puVar21) {
                      puVar29 = (ulong *)(pBVar32 + (long)pUVar47 + lVar14 + 8 + uVar15);
                      goto LAB_0011ca71;
                    }
                    lVar55 = lVar14 + uVar15 + 8;
                    lVar14 = lVar14 + 8;
                  } while (*(ulong *)(pBVar32 + (long)pUVar47 + lVar55) == *puVar21);
                  uVar53 = *puVar21 ^ *(ulong *)(pBVar32 + (long)pUVar47 + lVar55);
                  uVar46 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                    }
                  }
                  uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar14;
                }
                else {
                  uVar53 = *puVar20 ^ *puVar29;
                  uVar46 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                    }
                  }
                  uVar46 = uVar46 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0011ca71:
                if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar21 < puVar12) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                }
                uVar46 = (long)puVar21 - (long)puVar20;
              }
              pUVar47 = (U32 *)(uVar46 + (long)pUVar47);
              if (pUVar16 < pUVar47) {
                iVar64 = uVar24 + (U32)pUVar47;
                if (pUVar47 <= (U32 *)(ulong)(iVar9 - uVar24)) {
                  iVar64 = iVar9;
                }
                iVar9 = iVar64;
                pZVar2[uVar57].off = (uVar35 + 2) - uVar24;
                pZVar2[uVar57].len = (U32)pUVar47;
                uVar57 = (ulong)((int)uVar57 + 1);
                if (((U32 *)0x1000 < pUVar47) ||
                   (pUVar16 = pUVar47, (ulong *)((long)puVar38 + (long)pUVar47) == puVar12)) break;
              }
              puVar26 = pUVar18 + (uVar24 & uVar28) * 2;
              if ((pBVar32 + uVar15)[(long)pUVar47] < *(byte *)((long)puVar38 + (long)pUVar47)) {
                *puVar27 = uVar24;
                if (uVar24 <= uVar33) {
                  puVar27 = &local_15c;
                  break;
                }
                puVar26 = puVar26 + 1;
                puVar27 = puVar26;
                pUVar39 = pUVar47;
                pUVar47 = pUVar36;
              }
              else {
                *local_220 = uVar24;
                local_220 = puVar26;
                if (uVar24 <= uVar33) {
                  local_220 = &local_15c;
                  break;
                }
              }
              bVar60 = uVar59 == 0;
              uVar59 = uVar59 - 1;
              if ((bVar60) || (uVar24 = *puVar26, pUVar36 = pUVar47, uVar24 < (uint)local_118._0_4_)
                 ) break;
            } while( true );
          }
          *local_220 = 0;
          *puVar27 = 0;
          ms->nextToUpdate = iVar9 - 8;
        }
        goto LAB_0011ce6c;
      }
      goto LAB_0011cefd;
    }
LAB_0011f369:
    ZSTD_resetSeqStore(ssPtr);
    pBVar32 = (ms->window).base + -local_50;
    (ms->window).base = pBVar32;
    UVar23 = (ms->window).dictLimit + (int)local_50;
    (ms->window).dictLimit = UVar23;
    (ms->window).lowLimit = UVar23;
    ms->nextToUpdate = UVar23;
    ms->nextToUpdate3 = UVar23;
    if ((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) {
      puVar27 = local_f0->litFreq;
      iVar9 = 0;
      iVar64 = 0;
      iVar65 = 0;
      iVar66 = 0;
      lVar14 = 0;
      do {
        puVar26 = puVar27 + lVar14;
        uVar59 = *puVar26 * 0x10 - 1;
        uVar6 = puVar26[1] * 0x10 - 1;
        uVar33 = puVar26[2] * 0x10 - 1;
        uVar28 = puVar26[3] * 0x10 - 1;
        puVar26 = puVar27 + lVar14;
        *puVar26 = uVar59;
        puVar26[1] = uVar6;
        puVar26[2] = uVar33;
        puVar26[3] = uVar28;
        iVar9 = iVar9 + uVar59;
        iVar64 = iVar64 + uVar6;
        iVar65 = iVar65 + uVar33;
        iVar66 = iVar66 + uVar28;
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0x100);
      (ms->opt).litSum = iVar66 + iVar64 + iVar65 + iVar9;
    }
    puVar27 = (ms->opt).litLengthFreq;
    iVar9 = 0;
    iVar64 = 0;
    iVar65 = 0;
    iVar66 = 0;
    lVar14 = 0;
    do {
      puVar26 = puVar27 + lVar14;
      uVar59 = *puVar26 * 0x10 - 1;
      uVar6 = puVar26[1] * 0x10 - 1;
      uVar33 = puVar26[2] * 0x10 - 1;
      uVar28 = puVar26[3] * 0x10 - 1;
      puVar26 = puVar27 + lVar14;
      *puVar26 = uVar59;
      puVar26[1] = uVar6;
      puVar26[2] = uVar33;
      puVar26[3] = uVar28;
      iVar9 = iVar9 + uVar59;
      iVar64 = iVar64 + uVar6;
      iVar65 = iVar65 + uVar33;
      iVar66 = iVar66 + uVar28;
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x24);
    (ms->opt).litLengthSum = iVar66 + iVar64 + iVar65 + iVar9;
    puVar27 = (ms->opt).matchLengthFreq;
    lVar14 = 0;
    UVar23 = 0;
    do {
      iVar9 = puVar27[lVar14] * 0x10;
      puVar27[lVar14] = iVar9 - 1;
      UVar23 = (UVar23 + iVar9) - 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x35);
    (ms->opt).matchLengthSum = UVar23;
    puVar27 = (ms->opt).offCodeFreq;
    iVar9 = 0;
    iVar64 = 0;
    iVar65 = 0;
    iVar66 = 0;
    lVar14 = 0;
    do {
      puVar26 = puVar27 + lVar14;
      uVar59 = *puVar26 * 0x10 - 1;
      uVar6 = puVar26[1] * 0x10 - 1;
      uVar33 = puVar26[2] * 0x10 - 1;
      uVar28 = puVar26[3] * 0x10 - 1;
      puVar26 = puVar27 + lVar14;
      *puVar26 = uVar59;
      puVar26[1] = uVar6;
      puVar26[2] = uVar33;
      puVar26[3] = uVar28;
      iVar9 = iVar9 + uVar59;
      iVar64 = iVar64 + uVar6;
      iVar65 = iVar65 + uVar33;
      iVar66 = iVar66 + uVar28;
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x20);
    (ms->opt).offCodeSum = iVar66 + iVar64 + iVar65 + iVar9;
    srcSize = local_50;
  }
  local_f0 = &ms->opt;
  puVar58 = (ulong *)((long)local_130 + srcSize);
  puVar38 = (ulong *)((long)local_130 + (srcSize - 8));
  uVar59 = (ms->window).dictLimit;
  uVar6 = (ms->cParams).targetLength;
  if (0xffe < uVar6) {
    uVar6 = 0xfff;
  }
  local_108 = CONCAT44(local_108._4_4_,uVar6);
  uVar6 = (ms->cParams).minMatch;
  pZVar17 = (ms->opt).priceTable;
  pZVar2 = (ms->opt).matchTable;
  ms->nextToUpdate3 = ms->nextToUpdate;
  ZSTD_rescaleFreqs(local_f0,(BYTE *)local_130,srcSize,2);
  puVar30 = (ulong *)((ulong)((ulong *)(pBVar32 + uVar59) == local_130) + (long)local_130);
  puVar31 = local_130;
  if (puVar38 <= puVar30) {
LAB_00122c25:
    return (long)puVar58 - (long)puVar31;
  }
  uVar6 = (uint)(uVar6 != 3);
  uVar59 = uVar6 + 3;
  uVar15 = (ulong)(uVar6 + 2);
  puVar12 = (ulong *)((long)puVar58 - 7);
  puVar13 = (ulong *)((long)puVar58 - 3);
  puVar20 = (ulong *)((long)puVar58 - 1);
  local_68 = (U32 *)(ulong)(uVar6 + 5 & 0xfffffffc);
  lVar14 = (ulong)uVar59 - 2;
  auVar62._8_4_ = (int)lVar14;
  auVar62._0_8_ = lVar14;
  auVar62._12_4_ = (int)((ulong)lVar14 >> 0x20);
  local_d0 = pZVar17 + 4;
  local_78 = pZVar17 + 1;
  _local_118 = auVar62 ^ _DAT_0015c8b0;
  local_158 = pZVar17;
  local_a0 = puVar38;
LAB_0011f5e4:
  iVar9 = (int)puVar30;
  UVar23 = iVar9 - (int)puVar31;
  pBVar32 = (ms->window).base;
  uVar6 = ms->nextToUpdate;
  uVar46 = (ulong)uVar6;
  if (pBVar32 + uVar46 <= puVar30) {
    UVar8 = (ms->cParams).minMatch;
    uVar33 = iVar9 - (int)pBVar32;
    local_130 = puVar31;
    while (uVar6 < uVar33) {
      UVar7 = ZSTD_insertBt1(ms,pBVar32 + uVar46,(BYTE *)puVar58,UVar8,0);
      uVar6 = (int)uVar46 + UVar7;
      uVar46 = (ulong)uVar6;
    }
    ms->nextToUpdate = uVar33;
    if (UVar8 - 6 < 2) {
      uVar46 = (ulong)(UVar23 == 0);
      uVar6 = (ms->cParams).targetLength;
      if (0xffe < uVar6) {
        uVar6 = 0xfff;
      }
      pBVar32 = (ms->window).base;
      uVar35 = iVar9 - (int)pBVar32;
      uVar57 = *puVar30 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
      pUVar18 = ms->hashTable;
      uVar51 = 0;
      pUVar39 = ms->chainTable;
      uVar28 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar33 = uVar35 - uVar28;
      if (uVar35 < uVar28) {
        uVar33 = uVar51;
      }
      UVar8 = (ms->window).lowLimit;
      local_c8._0_4_ = UVar8 + (UVar8 == 0);
      uVar53 = (ulong)((uVar28 & uVar35) * 2);
      local_200 = pUVar39 + uVar53;
      local_218 = pUVar39 + uVar53 + 1;
      UVar8 = (ms->window).dictLimit;
      uVar24 = pUVar18[uVar57];
      iVar9 = uVar35 + 9;
      uVar44 = (ms->cParams).searchLog;
      uVar53 = uVar46 + 3;
      puVar38 = (ulong *)((long)puVar30 + 4);
      uVar48 = uVar15;
      do {
        if (uVar46 == 3) {
          UVar7 = *local_e0 - 1;
        }
        else {
          UVar7 = local_e0[uVar46];
        }
        uVar22 = 0;
        if ((UVar7 - 1 < uVar35 - UVar8) &&
           ((uint)*puVar30 == *(uint *)((long)puVar30 - (ulong)UVar7))) {
          lVar14 = -(ulong)UVar7;
          puVar31 = (ulong *)((long)puVar38 + lVar14);
          puVar29 = puVar38;
          if (puVar38 < puVar12) {
            if (*puVar31 == *puVar38) {
              lVar14 = lVar14 + 0xc;
              lVar55 = 0;
              do {
                puVar29 = (ulong *)((long)puVar30 + lVar55 + 0xc);
                if (puVar12 <= puVar29) {
                  puVar31 = (ulong *)((long)puVar30 + lVar55 + lVar14);
                  goto LAB_0011fb1b;
                }
                uVar22 = *(ulong *)((long)puVar30 + lVar55 + lVar14);
                lVar55 = lVar55 + 8;
              } while (uVar22 == *puVar29);
              uVar22 = *puVar29 ^ uVar22;
              uVar50 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              uVar52 = ((uint)(uVar50 >> 3) & 0x1fffffff) + (int)lVar55;
            }
            else {
              uVar50 = *puVar38 ^ *puVar31;
              uVar22 = 0;
              if (uVar50 != 0) {
                for (; (uVar50 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar52 = (uint)(uVar22 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_0011fb1b:
            if ((puVar29 < puVar13) && ((uint)*puVar31 == (uint)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar29 < puVar20) && ((short)*puVar31 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar29 < puVar58) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar29));
            }
            uVar52 = (int)puVar29 - (int)puVar38;
          }
          uVar22 = (ulong)(uVar52 + 4);
        }
        if (uVar48 < uVar22) {
          pZVar2[uVar51].off = (int)uVar46 - (uint)(UVar23 == 0);
          pZVar2[uVar51].len = (uint)uVar22;
          uVar51 = uVar51 + 1;
          if ((uVar6 < (uint)uVar22) ||
             (uVar48 = uVar22, (ulong *)((long)puVar30 + uVar22) == puVar58)) goto LAB_0012033b;
        }
        uVar46 = uVar46 + 1;
      } while (uVar46 < uVar53);
      pUVar18[uVar57] = uVar35;
      if ((uint)local_c8._0_4_ <= uVar24) {
        uVar6 = ~(-1 << ((byte)uVar44 & 0x1f));
        uVar57 = 0;
        uVar46 = 0;
        do {
          uVar22 = (ulong)uVar24;
          uVar53 = uVar46;
          if (uVar57 < uVar46) {
            uVar53 = uVar57;
          }
          puVar38 = (ulong *)((long)puVar30 + uVar53);
          puVar31 = (ulong *)(pBVar32 + uVar53 + uVar22);
          puVar29 = puVar38;
          if (puVar38 < puVar12) {
            if (*puVar31 == *puVar38) {
              lVar14 = 0;
              do {
                puVar29 = (ulong *)((long)puVar30 + lVar14 + uVar53 + 8);
                if (puVar12 <= puVar29) {
                  puVar31 = (ulong *)(pBVar32 + uVar22 + uVar53 + lVar14 + 8);
                  goto LAB_0011fcd8;
                }
                lVar55 = lVar14 + uVar22 + uVar53 + 8;
                lVar14 = lVar14 + 8;
              } while (*(ulong *)(pBVar32 + lVar55) == *puVar29);
              uVar41 = *puVar29 ^ *(ulong *)(pBVar32 + lVar55);
              uVar50 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              uVar50 = (uVar50 >> 3 & 0x1fffffff) + lVar14;
            }
            else {
              uVar41 = *puVar38 ^ *puVar31;
              uVar50 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              uVar50 = uVar50 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0011fcd8:
            if ((puVar29 < puVar13) && ((uint)*puVar31 == (uint)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar29 < puVar20) && ((short)*puVar31 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar29 < puVar58) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar29));
            }
            uVar50 = (long)puVar29 - (long)puVar38;
          }
          uVar50 = uVar50 + uVar53;
          if (uVar48 < uVar50) {
            iVar64 = uVar24 + (U32)uVar50;
            if (uVar50 <= iVar9 - uVar24) {
              iVar64 = iVar9;
            }
            iVar9 = iVar64;
            pZVar2[uVar51].off = (uVar35 + 2) - uVar24;
            pZVar2[uVar51].len = (U32)uVar50;
            uVar51 = uVar51 + 1;
            if ((0x1000 < uVar50) || (uVar48 = uVar50, (ulong *)((long)puVar30 + uVar50) == puVar58)
               ) break;
          }
          puVar27 = pUVar39 + (uVar24 & uVar28) * 2;
          if (pBVar32[uVar50 + uVar22] < *(byte *)((long)puVar30 + uVar50)) {
            *local_200 = uVar24;
            if (uVar24 <= uVar33) goto LAB_00122a91;
            puVar27 = puVar27 + 1;
            uVar57 = uVar50;
            local_200 = puVar27;
          }
          else {
            *local_218 = uVar24;
            local_218 = puVar27;
            uVar46 = uVar50;
            if (uVar24 <= uVar33) goto LAB_00122a84;
          }
          bVar60 = uVar6 == 0;
          uVar6 = uVar6 - 1;
          if ((bVar60) || (uVar24 = *puVar27, uVar24 < (uint)local_c8._0_4_)) break;
        } while( true );
      }
      goto LAB_00120068;
    }
    if (UVar8 == 5) {
      uVar46 = (ulong)(UVar23 == 0);
      uVar6 = (ms->cParams).targetLength;
      if (0xffe < uVar6) {
        uVar6 = 0xfff;
      }
      pBVar32 = (ms->window).base;
      uVar35 = iVar9 - (int)pBVar32;
      uVar57 = *puVar30 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
      pUVar18 = ms->hashTable;
      uVar51 = 0;
      pUVar39 = ms->chainTable;
      uVar28 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar33 = uVar35 - uVar28;
      if (uVar35 < uVar28) {
        uVar33 = uVar51;
      }
      UVar8 = (ms->window).lowLimit;
      local_c8._0_4_ = UVar8 + (UVar8 == 0);
      uVar53 = (ulong)((uVar28 & uVar35) * 2);
      local_200 = pUVar39 + uVar53;
      local_218 = pUVar39 + uVar53 + 1;
      UVar8 = (ms->window).dictLimit;
      uVar24 = pUVar18[uVar57];
      iVar9 = uVar35 + 9;
      uVar44 = (ms->cParams).searchLog;
      uVar53 = uVar46 + 3;
      puVar38 = (ulong *)((long)puVar30 + 4);
      uVar48 = uVar15;
      do {
        if (uVar46 == 3) {
          UVar7 = *local_e0 - 1;
        }
        else {
          UVar7 = local_e0[uVar46];
        }
        uVar22 = 0;
        if ((UVar7 - 1 < uVar35 - UVar8) &&
           ((uint)*puVar30 == *(uint *)((long)puVar30 - (ulong)UVar7))) {
          lVar14 = -(ulong)UVar7;
          puVar31 = (ulong *)((long)puVar38 + lVar14);
          puVar29 = puVar38;
          if (puVar38 < puVar12) {
            if (*puVar31 == *puVar38) {
              lVar14 = lVar14 + 0xc;
              lVar55 = 0;
              do {
                puVar29 = (ulong *)((long)puVar30 + lVar55 + 0xc);
                if (puVar12 <= puVar29) {
                  puVar31 = (ulong *)((long)puVar30 + lVar55 + lVar14);
                  goto LAB_0011ffa3;
                }
                uVar22 = *(ulong *)((long)puVar30 + lVar55 + lVar14);
                lVar55 = lVar55 + 8;
              } while (uVar22 == *puVar29);
              uVar22 = *puVar29 ^ uVar22;
              uVar50 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              uVar52 = ((uint)(uVar50 >> 3) & 0x1fffffff) + (int)lVar55;
            }
            else {
              uVar50 = *puVar38 ^ *puVar31;
              uVar22 = 0;
              if (uVar50 != 0) {
                for (; (uVar50 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar52 = (uint)(uVar22 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_0011ffa3:
            if ((puVar29 < puVar13) && ((uint)*puVar31 == (uint)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar29 < puVar20) && ((short)*puVar31 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar29 < puVar58) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar29));
            }
            uVar52 = (int)puVar29 - (int)puVar38;
          }
          uVar22 = (ulong)(uVar52 + 4);
        }
        if (uVar48 < uVar22) {
          pZVar2[uVar51].off = (int)uVar46 - (uint)(UVar23 == 0);
          pZVar2[uVar51].len = (uint)uVar22;
          uVar51 = uVar51 + 1;
          if ((uVar6 < (uint)uVar22) ||
             (uVar48 = uVar22, (ulong *)((long)puVar30 + uVar22) == puVar58)) goto LAB_0012033b;
        }
        uVar46 = uVar46 + 1;
      } while (uVar46 < uVar53);
      pUVar18[uVar57] = uVar35;
      if ((uint)local_c8._0_4_ <= uVar24) {
        uVar6 = ~(-1 << ((byte)uVar44 & 0x1f));
        uVar57 = 0;
        uVar46 = 0;
        do {
          uVar22 = (ulong)uVar24;
          uVar53 = uVar46;
          if (uVar57 < uVar46) {
            uVar53 = uVar57;
          }
          puVar38 = (ulong *)((long)puVar30 + uVar53);
          puVar31 = (ulong *)(pBVar32 + uVar53 + uVar22);
          puVar29 = puVar38;
          if (puVar38 < puVar12) {
            if (*puVar31 == *puVar38) {
              lVar14 = 0;
              do {
                puVar29 = (ulong *)((long)puVar30 + lVar14 + uVar53 + 8);
                if (puVar12 <= puVar29) {
                  puVar31 = (ulong *)(pBVar32 + uVar22 + uVar53 + lVar14 + 8);
                  goto LAB_00122245;
                }
                lVar55 = lVar14 + uVar22 + uVar53 + 8;
                lVar14 = lVar14 + 8;
              } while (*(ulong *)(pBVar32 + lVar55) == *puVar29);
              uVar41 = *puVar29 ^ *(ulong *)(pBVar32 + lVar55);
              uVar50 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              uVar50 = (uVar50 >> 3 & 0x1fffffff) + lVar14;
            }
            else {
              uVar41 = *puVar38 ^ *puVar31;
              uVar50 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              uVar50 = uVar50 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00122245:
            if ((puVar29 < puVar13) && ((uint)*puVar31 == (uint)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar29 < puVar20) && ((short)*puVar31 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar29 < puVar58) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar29));
            }
            uVar50 = (long)puVar29 - (long)puVar38;
          }
          uVar50 = uVar50 + uVar53;
          if (uVar48 < uVar50) {
            iVar64 = uVar24 + (U32)uVar50;
            if (uVar50 <= iVar9 - uVar24) {
              iVar64 = iVar9;
            }
            iVar9 = iVar64;
            pZVar2[uVar51].off = (uVar35 + 2) - uVar24;
            pZVar2[uVar51].len = (U32)uVar50;
            uVar51 = uVar51 + 1;
            if ((0x1000 < uVar50) || (uVar48 = uVar50, (ulong *)((long)puVar30 + uVar50) == puVar58)
               ) break;
          }
          puVar27 = pUVar39 + (uVar24 & uVar28) * 2;
          if (pBVar32[uVar50 + uVar22] < *(byte *)((long)puVar30 + uVar50)) {
            *local_200 = uVar24;
            if (uVar24 <= uVar33) goto LAB_00122a91;
            puVar27 = puVar27 + 1;
            uVar57 = uVar50;
            local_200 = puVar27;
          }
          else {
            *local_218 = uVar24;
            local_218 = puVar27;
            uVar46 = uVar50;
            if (uVar24 <= uVar33) goto LAB_00122a84;
          }
          bVar60 = uVar6 == 0;
          uVar6 = uVar6 - 1;
          if ((bVar60) || (uVar24 = *puVar27, uVar24 < (uint)local_c8._0_4_)) break;
        } while( true );
      }
      goto LAB_00120068;
    }
    if (UVar8 == 3) {
      uVar46 = (ulong)(uint)(UVar23 == 0);
      uVar6 = (ms->cParams).targetLength;
      if (0xffe < uVar6) {
        uVar6 = 0xfff;
      }
      pBVar32 = (ms->window).base;
      uVar35 = iVar9 - (int)pBVar32;
      uVar44 = (uint)*puVar30 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
      pUVar18 = ms->hashTable;
      uVar51 = 0;
      pUVar39 = ms->chainTable;
      uVar28 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar33 = uVar35 - uVar28;
      if (uVar35 < uVar28) {
        uVar33 = uVar51;
      }
      UVar8 = (ms->window).lowLimit;
      uVar25 = UVar8 + (UVar8 == 0);
      uVar57 = (ulong)((uVar28 & uVar35) * 2);
      local_c8 = (undefined1  [8])(pUVar39 + uVar57);
      local_218 = pUVar39 + uVar57 + 1;
      UVar8 = (ms->window).dictLimit;
      uVar52 = pUVar18[uVar44];
      iVar9 = uVar35 + 9;
      uVar24 = (ms->cParams).searchLog;
      uVar57 = uVar46 + 3;
      puVar38 = (ulong *)((long)puVar30 + 3);
      uVar53 = uVar15;
      do {
        if (uVar46 == 3) {
          UVar7 = *local_e0 - 1;
        }
        else {
          UVar7 = local_e0[uVar46];
        }
        uVar45 = 0;
        if ((UVar7 - 1 < uVar35 - UVar8) &&
           (uVar45 = 0, ((*(uint *)((long)puVar30 - (ulong)UVar7) ^ (uint)*puVar30) & 0xffffff) == 0
           )) {
          lVar14 = -(ulong)UVar7;
          puVar31 = (ulong *)((long)puVar38 + lVar14);
          puVar29 = puVar38;
          if (puVar38 < puVar12) {
            if (*puVar31 == *puVar38) {
              lVar14 = lVar14 + 0xb;
              lVar55 = 0;
              do {
                puVar29 = (ulong *)((long)puVar30 + lVar55 + 0xb);
                if (puVar12 <= puVar29) {
                  puVar31 = (ulong *)((long)puVar30 + lVar55 + lVar14);
                  goto LAB_0011f824;
                }
                uVar48 = *(ulong *)((long)puVar30 + lVar55 + lVar14);
                lVar55 = lVar55 + 8;
              } while (uVar48 == *puVar29);
              uVar48 = *puVar29 ^ uVar48;
              uVar22 = 0;
              if (uVar48 != 0) {
                for (; (uVar48 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar45 = ((uint)(uVar22 >> 3) & 0x1fffffff) + (int)lVar55;
            }
            else {
              uVar22 = *puVar38 ^ *puVar31;
              uVar48 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                }
              }
              uVar45 = (uint)(uVar48 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_0011f824:
            if ((puVar29 < puVar13) && ((uint)*puVar31 == (uint)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar29 < puVar20) && ((short)*puVar31 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar29 < puVar58) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar29));
            }
            uVar45 = (int)puVar29 - (int)puVar38;
          }
          uVar45 = uVar45 + 3;
        }
        uVar48 = (ulong)uVar45;
        if (uVar53 < uVar48) {
          pZVar2[uVar51].off = (int)uVar46 - (uint)(UVar23 == 0);
          pZVar2[uVar51].len = uVar45;
          uVar51 = uVar51 + 1;
          if ((uVar6 < uVar45) || (uVar53 = uVar48, (ulong *)((long)puVar30 + uVar48) == puVar58))
          goto LAB_0012033b;
        }
        uVar46 = uVar46 + 1;
      } while (uVar46 < uVar57);
      if (((uVar53 < 3) &&
          (UVar8 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar30), uVar25 <= UVar8)) &&
         (uVar35 - UVar8 < 0x40000)) {
        uVar46 = (ulong)UVar8;
        puVar31 = (ulong *)(pBVar32 + uVar46);
        puVar38 = puVar30;
        if (puVar30 < puVar12) {
          if (*puVar31 == *puVar30) {
            lVar14 = 0;
            do {
              puVar38 = (ulong *)((long)puVar30 + lVar14 + 8);
              if (puVar12 <= puVar38) {
                puVar31 = (ulong *)(pBVar32 + lVar14 + uVar46 + 8);
                puVar38 = (ulong *)((long)puVar30 + lVar14 + 8);
                goto LAB_00122b95;
              }
              lVar55 = lVar14 + uVar46 + 8;
              uVar57 = *puVar38;
              lVar14 = lVar14 + 8;
            } while (*(ulong *)(pBVar32 + lVar55) == uVar57);
            uVar57 = uVar57 ^ *(ulong *)(pBVar32 + lVar55);
            uVar46 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar14;
          }
          else {
            uVar57 = *puVar30 ^ *puVar31;
            uVar46 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            uVar46 = uVar46 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00122b95:
          if ((puVar38 < puVar13) && ((uint)*puVar31 == (uint)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 4);
            puVar31 = (ulong *)((long)puVar31 + 4);
          }
          if ((puVar38 < puVar20) && ((short)*puVar31 == (short)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 2);
            puVar31 = (ulong *)((long)puVar31 + 2);
          }
          if (puVar38 < puVar58) {
            puVar38 = (ulong *)((long)puVar38 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar38));
          }
          uVar46 = (long)puVar38 - (long)puVar30;
        }
        if (uVar46 < 3) goto LAB_001202f6;
        pZVar2->off = (uVar35 - UVar8) + 2;
        pZVar2->len = (U32)uVar46;
        if ((uVar46 <= uVar6) &&
           (uVar51 = 1, uVar53 = uVar46, (ulong *)((long)puVar30 + uVar46) != puVar58))
        goto LAB_001202f6;
        UVar8 = uVar35 + 1;
        uVar51 = 1;
      }
      else {
LAB_001202f6:
        pUVar18[uVar44] = uVar35;
        if (uVar25 <= uVar52) {
          uVar6 = ~(-1 << ((byte)uVar24 & 0x1f));
          uVar57 = 0;
          uVar46 = 0;
          do {
            uVar22 = (ulong)uVar52;
            uVar48 = uVar46;
            if (uVar57 < uVar46) {
              uVar48 = uVar57;
            }
            puVar38 = (ulong *)((long)puVar30 + uVar48);
            puVar31 = (ulong *)(pBVar32 + uVar48 + uVar22);
            puVar29 = puVar38;
            if (puVar38 < puVar12) {
              if (*puVar31 == *puVar38) {
                lVar14 = 0;
                do {
                  puVar29 = (ulong *)((long)puVar30 + lVar14 + uVar48 + 8);
                  if (puVar12 <= puVar29) {
                    puVar31 = (ulong *)(pBVar32 + uVar22 + uVar48 + lVar14 + 8);
                    goto LAB_001226a3;
                  }
                  lVar55 = lVar14 + uVar22 + uVar48 + 8;
                  lVar14 = lVar14 + 8;
                } while (*(ulong *)(pBVar32 + lVar55) == *puVar29);
                uVar41 = *puVar29 ^ *(ulong *)(pBVar32 + lVar55);
                uVar50 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                  }
                }
                uVar50 = (uVar50 >> 3 & 0x1fffffff) + lVar14;
              }
              else {
                uVar41 = *puVar38 ^ *puVar31;
                uVar50 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                  }
                }
                uVar50 = uVar50 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001226a3:
              if ((puVar29 < puVar13) && ((uint)*puVar31 == (uint)*puVar29)) {
                puVar29 = (ulong *)((long)puVar29 + 4);
                puVar31 = (ulong *)((long)puVar31 + 4);
              }
              if ((puVar29 < puVar20) && ((short)*puVar31 == (short)*puVar29)) {
                puVar29 = (ulong *)((long)puVar29 + 2);
                puVar31 = (ulong *)((long)puVar31 + 2);
              }
              if (puVar29 < puVar58) {
                puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar29));
              }
              uVar50 = (long)puVar29 - (long)puVar38;
            }
            uVar50 = uVar50 + uVar48;
            if (uVar53 < uVar50) {
              iVar64 = uVar52 + (U32)uVar50;
              if (uVar50 <= iVar9 - uVar52) {
                iVar64 = iVar9;
              }
              iVar9 = iVar64;
              pZVar2[uVar51].off = (uVar35 + 2) - uVar52;
              pZVar2[uVar51].len = (U32)uVar50;
              uVar51 = uVar51 + 1;
              if ((0x1000 < uVar50) ||
                 (uVar53 = uVar50, (ulong *)((long)puVar30 + uVar50) == puVar58)) break;
            }
            puVar27 = pUVar39 + (uVar52 & uVar28) * 2;
            if (pBVar32[uVar50 + uVar22] < *(byte *)((long)puVar30 + uVar50)) {
              *(uint *)local_c8 = uVar52;
              if (uVar52 <= uVar33) {
                local_c8 = (undefined1  [8])&local_140;
                break;
              }
              puVar27 = puVar27 + 1;
              local_c8 = (undefined1  [8])puVar27;
              uVar57 = uVar50;
            }
            else {
              *local_218 = uVar52;
              uVar46 = uVar50;
              local_218 = puVar27;
              if (uVar52 <= uVar33) {
                local_218 = (uint *)&local_140;
                break;
              }
            }
            bVar60 = uVar6 == 0;
            uVar6 = uVar6 - 1;
            if ((bVar60) || (uVar52 = *puVar27, uVar52 < uVar25)) break;
          } while( true );
        }
        *local_218 = 0;
        *(undefined4 *)local_c8 = 0;
        UVar8 = iVar9 - 8;
      }
      ms->nextToUpdate = UVar8;
    }
    else {
      uVar46 = (ulong)(UVar23 == 0);
      uVar6 = (ms->cParams).targetLength;
      if (0xffe < uVar6) {
        uVar6 = 0xfff;
      }
      pBVar32 = (ms->window).base;
      uVar35 = iVar9 - (int)pBVar32;
      uVar44 = (uint)*puVar30 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
      pUVar18 = ms->hashTable;
      uVar51 = 0;
      pUVar39 = ms->chainTable;
      uVar28 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar33 = uVar35 - uVar28;
      if (uVar35 < uVar28) {
        uVar33 = uVar51;
      }
      UVar8 = (ms->window).lowLimit;
      local_c8._0_4_ = UVar8 + (UVar8 == 0);
      uVar57 = (ulong)((uVar28 & uVar35) * 2);
      local_200 = pUVar39 + uVar57;
      local_218 = pUVar39 + uVar57 + 1;
      UVar8 = (ms->window).dictLimit;
      uVar52 = pUVar18[uVar44];
      iVar9 = uVar35 + 9;
      uVar24 = (ms->cParams).searchLog;
      uVar57 = uVar46 + 3;
      puVar38 = (ulong *)((long)puVar30 + 4);
      uVar53 = uVar15;
      do {
        if (uVar46 == 3) {
          UVar7 = *local_e0 - 1;
        }
        else {
          UVar7 = local_e0[uVar46];
        }
        uVar25 = 0;
        if ((UVar7 - 1 < uVar35 - UVar8) &&
           (uVar25 = 0, (uint)*puVar30 == *(uint *)((long)puVar30 - (ulong)UVar7))) {
          lVar14 = -(ulong)UVar7;
          puVar31 = (ulong *)((long)puVar38 + lVar14);
          puVar29 = puVar38;
          if (puVar38 < puVar12) {
            if (*puVar31 == *puVar38) {
              lVar14 = lVar14 + 0xc;
              lVar55 = 0;
              do {
                puVar29 = (ulong *)((long)puVar30 + lVar55 + 0xc);
                if (puVar12 <= puVar29) {
                  puVar31 = (ulong *)((long)puVar30 + lVar55 + lVar14);
                  goto LAB_0012020c;
                }
                uVar48 = *(ulong *)((long)puVar30 + lVar55 + lVar14);
                lVar55 = lVar55 + 8;
              } while (uVar48 == *puVar29);
              uVar48 = *puVar29 ^ uVar48;
              uVar22 = 0;
              if (uVar48 != 0) {
                for (; (uVar48 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar25 = ((uint)(uVar22 >> 3) & 0x1fffffff) + (int)lVar55;
            }
            else {
              uVar22 = *puVar38 ^ *puVar31;
              uVar48 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                }
              }
              uVar25 = (uint)(uVar48 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_0012020c:
            if ((puVar29 < puVar13) && ((uint)*puVar31 == (uint)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar29 < puVar20) && ((short)*puVar31 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar29 < puVar58) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar29));
            }
            uVar25 = (int)puVar29 - (int)puVar38;
          }
          uVar25 = uVar25 + 4;
        }
        uVar48 = (ulong)uVar25;
        if (uVar53 < uVar48) {
          pZVar2[uVar51].off = (int)uVar46 - (uint)(UVar23 == 0);
          pZVar2[uVar51].len = uVar25;
          uVar51 = uVar51 + 1;
          if ((uVar6 < uVar25) || (uVar53 = uVar48, (ulong *)((long)puVar30 + uVar48) == puVar58))
          goto LAB_0012033b;
        }
        uVar46 = uVar46 + 1;
      } while (uVar46 < uVar57);
      pUVar18[uVar44] = uVar35;
      if ((uint)local_c8._0_4_ <= uVar52) {
        uVar6 = ~(-1 << ((byte)uVar24 & 0x1f));
        uVar57 = 0;
        uVar46 = 0;
        do {
          uVar22 = (ulong)uVar52;
          uVar48 = uVar46;
          if (uVar57 < uVar46) {
            uVar48 = uVar57;
          }
          puVar38 = (ulong *)((long)puVar30 + uVar48);
          puVar31 = (ulong *)(pBVar32 + uVar48 + uVar22);
          puVar29 = puVar38;
          if (puVar38 < puVar12) {
            if (*puVar31 == *puVar38) {
              lVar14 = 0;
              do {
                puVar29 = (ulong *)((long)puVar30 + lVar14 + uVar48 + 8);
                if (puVar12 <= puVar29) {
                  puVar31 = (ulong *)(pBVar32 + uVar22 + uVar48 + lVar14 + 8);
                  goto LAB_0012246f;
                }
                lVar55 = lVar14 + uVar22 + uVar48 + 8;
                lVar14 = lVar14 + 8;
              } while (*(ulong *)(pBVar32 + lVar55) == *puVar29);
              uVar41 = *puVar29 ^ *(ulong *)(pBVar32 + lVar55);
              uVar50 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              uVar50 = (uVar50 >> 3 & 0x1fffffff) + lVar14;
            }
            else {
              uVar41 = *puVar38 ^ *puVar31;
              uVar50 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              uVar50 = uVar50 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0012246f:
            if ((puVar29 < puVar13) && ((uint)*puVar31 == (uint)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar29 < puVar20) && ((short)*puVar31 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar29 < puVar58) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar29));
            }
            uVar50 = (long)puVar29 - (long)puVar38;
          }
          uVar50 = uVar50 + uVar48;
          if (uVar53 < uVar50) {
            iVar64 = uVar52 + (U32)uVar50;
            if (uVar50 <= iVar9 - uVar52) {
              iVar64 = iVar9;
            }
            iVar9 = iVar64;
            pZVar2[uVar51].off = (uVar35 + 2) - uVar52;
            pZVar2[uVar51].len = (U32)uVar50;
            uVar51 = uVar51 + 1;
            if ((0x1000 < uVar50) || (uVar53 = uVar50, (ulong *)((long)puVar30 + uVar50) == puVar58)
               ) break;
          }
          puVar27 = pUVar39 + (uVar52 & uVar28) * 2;
          if (pBVar32[uVar50 + uVar22] < *(byte *)((long)puVar30 + uVar50)) {
            *local_200 = uVar52;
            if (uVar52 <= uVar33) {
              local_200 = (uint *)&local_140;
              break;
            }
            puVar27 = puVar27 + 1;
            uVar57 = uVar50;
            local_200 = puVar27;
          }
          else {
            *local_218 = uVar52;
            local_218 = puVar27;
            uVar46 = uVar50;
            if (uVar52 <= uVar33) {
              local_218 = (uint *)&local_140;
              break;
            }
          }
          bVar60 = uVar6 == 0;
          uVar6 = uVar6 - 1;
          if ((bVar60) || (uVar52 = *puVar27, uVar52 < (uint)local_c8._0_4_)) break;
        } while( true );
      }
      *local_218 = 0;
      *local_200 = 0;
      ms->nextToUpdate = iVar9 - 8;
    }
    goto LAB_0012033b;
  }
  goto LAB_001203f0;
LAB_0011cde8:
  local_220 = &local_15c;
  goto LAB_0011c467;
LAB_0011cdf5:
  puVar27 = &local_15c;
LAB_0011c467:
  *local_220 = 0;
  *puVar27 = 0;
  ms->nextToUpdate = iVar9 - 8;
LAB_0011ce6c:
  poVar37 = local_f0;
  pZVar17 = local_158;
  ssPtr = local_98;
  if ((int)uVar57 == 0) {
LAB_0011cefd:
    puVar38 = (ulong *)((long)puVar38 + 1);
    goto LAB_0011f22c;
  }
  local_68[2] = local_138;
  *(ulong *)local_68 = local_140;
  local_158->mlen = 0;
  local_158->litlen = UVar23;
  iVar9 = ZSTD_literalsContribution((BYTE *)puVar30,UVar23,local_f0,2);
  pZVar17->price = iVar9;
  uVar33 = (int)uVar57 - 1;
  uVar59 = pZVar2[uVar33].len;
  if ((uint)local_80 < uVar59) {
    UVar8 = pZVar2[uVar33].off;
    uVar15 = 0;
  }
  else {
    UVar8 = ZSTD_litLengthPrice(0,poVar37,2);
    auVar63 = _DAT_0015dce0;
    auVar62 = _DAT_0015dcd0;
    auVar61 = _DAT_0015c8b0;
    uVar15 = 0;
    pZVar17 = local_78;
    do {
      auVar69._8_4_ = (int)uVar15;
      auVar69._0_8_ = uVar15;
      auVar69._12_4_ = (int)(uVar15 >> 0x20);
      auVar67 = (auVar69 | auVar63) ^ auVar61;
      if ((bool)(~(auVar67._4_4_ == local_c8._4_4_ && (int)local_c8._0_4_ < auVar67._0_4_ ||
                  (int)local_c8._4_4_ < auVar67._4_4_) & 1)) {
        pZVar17[-3].price = 0x40000000;
      }
      if ((auVar67._12_4_ != uStack_c0._4_4_ || auVar67._8_4_ <= (int)uStack_c0) &&
          auVar67._12_4_ <= uStack_c0._4_4_) {
        pZVar17[-2].price = 0x40000000;
      }
      auVar69 = (auVar69 | auVar62) ^ auVar61;
      iVar64 = auVar69._4_4_;
      if (iVar64 <= (int)local_c8._4_4_ &&
          (iVar64 != local_c8._4_4_ || auVar69._0_4_ <= (int)local_c8._0_4_)) {
        pZVar17[-1].price = 0x40000000;
        pZVar17->price = 0x40000000;
      }
      uVar15 = uVar15 + 4;
      pZVar17 = pZVar17 + 4;
    } while (local_38 != uVar15);
    uVar46 = 0;
    uVar15 = (ulong)uVar6;
    do {
      UVar7 = pZVar2[uVar46].off;
      uVar59 = pZVar2[uVar46].len;
      rVar72 = ZSTD_updateRep((U32 *)&local_140,UVar7,(uint)(UVar23 == 0));
      if ((uint)uVar15 <= uVar59) {
        uVar33 = 0x1f;
        if (UVar7 + 1 != 0) {
          for (; UVar7 + 1 >> uVar33 == 0; uVar33 = uVar33 - 1) {
          }
        }
        uVar28 = (uint)uVar15 * 0x100 - 0x200;
        do {
          UVar10 = (U32)uVar15;
          if ((ms->opt).priceType == zop_predef) {
            iVar64 = 0x1f;
            if (UVar10 - 2 != 0) {
              for (; UVar10 - 2 >> iVar64 == 0; iVar64 = iVar64 + -1) {
              }
            }
            iVar64 = (iVar64 + uVar33) * 0x100 + (uVar28 >> ((byte)iVar64 & 0x1f)) + 0x1000;
          }
          else {
            uVar51 = UVar10 - 3;
            uVar35 = (ms->opt).offCodeFreq[uVar33] + 1;
            iVar64 = 0x1f;
            if (uVar35 != 0) {
              for (; uVar35 >> iVar64 == 0; iVar64 = iVar64 + -1) {
              }
            }
            if (uVar51 < 0x80) {
              uVar51 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar51];
            }
            else {
              uVar44 = 0x1f;
              if (uVar51 != 0) {
                for (; uVar51 >> uVar44 == 0; uVar44 = uVar44 - 1) {
                }
              }
              uVar51 = (uVar44 ^ 0xffffffe0) + 0x44;
            }
            uVar44 = (ms->opt).matchLengthFreq[uVar51] + 1;
            iVar65 = 0x1f;
            if (uVar44 != 0) {
              for (; uVar44 >> iVar65 == 0; iVar65 = iVar65 + -1) {
              }
            }
            iVar64 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar35 * 0x100 >> ((byte)iVar64 & 0x1f)) +
                     (uVar44 * 0x100 >> ((byte)iVar65 & 0x1f)))) +
                     ((ML_bits[uVar51] + uVar33) - (iVar64 + iVar65)) * 0x100 + 0x33;
          }
          local_158[uVar15].mlen = UVar10;
          local_158[uVar15].off = UVar7;
          local_158[uVar15].litlen = UVar23;
          local_158[uVar15].price = iVar64 + UVar8 + iVar9;
          *(long *)local_158[uVar15].rep = rVar72.rep._0_8_;
          local_158[uVar15].rep[2] = rVar72.rep[2];
          uVar15 = (ulong)(UVar10 + 1);
          uVar28 = uVar28 + 0x100;
        } while (UVar10 + 1 <= uVar59);
      }
      uVar46 = uVar46 + 1;
    } while (uVar46 != uVar57);
    uVar59 = (int)uVar15 - 1;
    uVar15 = (ulong)uVar59;
    pZVar17 = local_158;
    if (uVar59 == 0) {
      uVar46 = 0;
    }
    else {
      local_128 = (uint *)((long)puVar38 + 0xc);
      local_b0 = puVar38 + 1;
      local_70 = (long)puVar38 + 0xb;
      uVar57 = 1;
      do {
        poVar37 = local_f0;
        iVar9 = (int)uVar57;
        pZVar54 = pZVar17 + (iVar9 - 1U);
        UVar23 = 1;
        if (pZVar17[iVar9 - 1U].mlen == 0) {
          UVar23 = pZVar54->litlen + 1;
        }
        puVar20 = (ulong *)((long)puVar38 + uVar57);
        iVar64 = pZVar54->price;
        UVar8 = ZSTD_rawLiteralsCost((BYTE *)((long)puVar20 + -1),1,local_f0,2);
        UVar7 = ZSTD_litLengthPrice(UVar23,poVar37,2);
        UVar10 = ZSTD_litLengthPrice(UVar23 - 1,poVar37,2);
        iVar65 = (UVar7 + UVar8 + iVar64) - UVar10;
        pZVar1 = pZVar17 + uVar57;
        iVar64 = pZVar17[uVar57].price;
        if (iVar65 <= pZVar17[uVar57].price) {
          pZVar1->off = 0;
          pZVar1->mlen = 0;
          pZVar1->litlen = UVar23;
          pZVar1->price = iVar65;
          *(undefined8 *)pZVar1->rep = *(undefined8 *)pZVar54->rep;
          pZVar1->rep[2] = pZVar54->rep[2];
          iVar64 = iVar65;
        }
        if (puVar20 <= local_a0) {
          pZVar17 = local_158;
          uVar46 = uVar57;
          if (iVar9 == (int)uVar15) break;
          UVar8 = pZVar1->mlen;
          UVar23 = 0;
          if (UVar8 == 0) {
            UVar23 = pZVar1->litlen;
          }
          local_118 = (undefined1  [8])pZVar1;
          UVar7 = ZSTD_litLengthPrice(0,local_f0,2);
          pBVar32 = (ms->window).base;
          uVar59 = ms->nextToUpdate;
          uVar46 = (ulong)uVar59;
          pZVar17 = local_158;
          if (pBVar32 + uVar46 <= puVar20) {
            local_a8 = uVar15;
            local_60 = (uint *)(uVar57 * 0x1c);
            UVar10 = (ms->cParams).minMatch;
            iVar65 = (int)puVar20;
            uVar33 = iVar65 - (int)pBVar32;
            uVar15 = local_a8;
            while (local_158 = pZVar17, local_a8 = uVar15, uVar59 < uVar33) {
              UVar11 = ZSTD_insertBt1(ms,pBVar32 + uVar46,(BYTE *)puVar12,UVar10,0);
              uVar59 = (int)uVar46 + UVar11;
              uVar46 = (ulong)uVar59;
              uVar15 = local_a8;
              pZVar17 = local_158;
            }
            local_120 = (U32 *)((long)local_b0 + uVar57);
            ms->nextToUpdate = uVar33;
            local_d8._4_4_ = (undefined4)((ulong)local_d8 >> 0x20);
            local_148._4_4_ = (undefined4)((ulong)local_148 >> 0x20);
            local_d0._4_4_ = (undefined4)((ulong)local_d0 >> 0x20);
            auVar34 = local_118;
            if (UVar10 - 6 < 2) {
              uVar46 = (ulong)(UVar8 != 0);
              uVar59 = (ms->cParams).targetLength;
              if (0xffe < uVar59) {
                uVar59 = 0xfff;
              }
              pBVar32 = (ms->window).base;
              uVar35 = iVar65 - (int)pBVar32;
              local_150 = ms->hashTable;
              uVar53 = 0;
              local_e8 = *puVar20 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
              local_f8 = ms->chainTable;
              uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar28 = uVar35 - uVar33;
              if (uVar35 < uVar33) {
                uVar28 = 0;
              }
              local_d8 = (U32 *)CONCAT44(local_d8._4_4_,uVar28);
              UVar10 = (ms->window).lowLimit;
              uVar24 = UVar10 + (UVar10 == 0);
              local_148 = (BYTE *)CONCAT44(local_148._4_4_,uVar33);
              uVar48 = (ulong)((uVar33 & uVar35) * 2);
              local_1f0 = local_f8 + uVar48;
              local_208 = local_f8 + uVar48 + 1;
              UVar10 = (ms->window).dictLimit;
              uVar44 = local_150[local_e8];
              local_108 = (ulong)uVar35;
              iVar65 = uVar35 + 9;
              uVar51 = (ms->cParams).searchLog;
              local_d0 = (ZSTD_optimal_t *)CONCAT44(local_d0._4_4_,uVar51);
              uVar48 = uVar46 + 3;
              puVar29 = (ulong *)((long)puVar20 + 4);
              pUVar18 = local_100;
              do {
                if (uVar46 == 3) {
                  uVar52 = *(int *)((long)local_118 + 0x10) - 1;
                }
                else {
                  uVar52 = *(uint *)((long)local_118 + 0x10 + uVar46 * 4);
                }
                pUVar39 = (U32 *)0x0;
                if ((uVar52 - 1 < uVar35 - UVar10) &&
                   ((uint)*puVar20 == *(uint *)((long)puVar20 - (ulong)uVar52))) {
                  lVar14 = -(ulong)uVar52;
                  puVar21 = (ulong *)((long)puVar29 + lVar14);
                  puVar56 = puVar29;
                  if (puVar29 < puVar58) {
                    if (*puVar21 == *puVar29) {
                      lVar14 = lVar14 + uVar57;
                      lVar55 = 0;
                      do {
                        puVar56 = (ulong *)((long)local_128 + lVar55 + uVar57);
                        if (puVar58 <= puVar56) {
                          puVar21 = (ulong *)((long)local_128 + lVar55 + lVar14);
                          goto LAB_0011d97e;
                        }
                        uVar22 = *(ulong *)((long)local_128 + lVar55 + lVar14);
                        lVar55 = lVar55 + 8;
                      } while (uVar22 == *puVar56);
                      uVar22 = *puVar56 ^ uVar22;
                      uVar50 = 0;
                      if (uVar22 != 0) {
                        for (; (uVar22 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                        }
                      }
                      uVar52 = ((uint)(uVar50 >> 3) & 0x1fffffff) + (int)lVar55;
                    }
                    else {
                      uVar50 = *puVar29 ^ *puVar21;
                      uVar22 = 0;
                      if (uVar50 != 0) {
                        for (; (uVar50 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      uVar52 = (uint)(uVar22 >> 3) & 0x1fffffff;
                    }
                  }
                  else {
LAB_0011d97e:
                    if ((puVar56 < puVar31) && ((uint)*puVar21 == (uint)*puVar56)) {
                      puVar56 = (ulong *)((long)puVar56 + 4);
                      puVar21 = (ulong *)((long)puVar21 + 4);
                    }
                    if ((puVar56 < puVar13) && ((short)*puVar21 == (short)*puVar56)) {
                      puVar56 = (ulong *)((long)puVar56 + 2);
                      puVar21 = (ulong *)((long)puVar21 + 2);
                    }
                    if (puVar56 < puVar12) {
                      puVar56 = (ulong *)((long)puVar56 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar56))
                      ;
                    }
                    uVar52 = (int)puVar56 - (int)puVar29;
                  }
                  pUVar39 = (U32 *)(ulong)(uVar52 + 4);
                }
                if (pUVar18 < pUVar39) {
                  pZVar2[uVar53].off = (int)uVar46 - (uint)(UVar8 != 0);
                  pZVar2[uVar53].len = (uint)pUVar39;
                  uVar52 = (int)uVar53 + 1;
                  uVar53 = (ulong)uVar52;
                  if ((uVar59 < (uint)pUVar39) ||
                     (pUVar18 = pUVar39, (ulong *)((long)puVar20 + (long)pUVar39) == puVar12))
                  goto LAB_0011e23c;
                }
                uVar52 = (uint)uVar53;
                uVar46 = uVar46 + 1;
              } while (uVar46 < uVar48);
              local_150[local_e8] = uVar35;
              if (uVar24 <= uVar44) {
                uVar59 = ~(-1 << ((byte)uVar51 & 0x1f));
                local_108 = (ulong)(uVar35 + 2);
                local_150 = (U32 *)(pBVar32 + 8);
                local_190 = (U32 *)0x0;
                pUVar39 = (U32 *)0x0;
                do {
                  uVar46 = (ulong)uVar44;
                  pUVar16 = pUVar39;
                  if (local_190 < pUVar39) {
                    pUVar16 = local_190;
                  }
                  puVar56 = (ulong *)((long)puVar20 + (long)pUVar16);
                  puVar29 = (ulong *)(pBVar32 + uVar46 + (long)pUVar16);
                  puVar21 = puVar56;
                  if (puVar56 < puVar58) {
                    if (*puVar29 == *puVar56) {
                      lVar14 = 0;
                      do {
                        puVar21 = (ulong *)((long)local_120 + (long)pUVar16 + lVar14);
                        if (puVar58 <= puVar21) {
                          puVar29 = (ulong *)((long)local_150 + (long)pUVar16 + lVar14 + uVar46);
                          goto LAB_0011e0e4;
                        }
                        uVar57 = *(ulong *)((long)local_150 + (long)pUVar16 + lVar14 + uVar46);
                        lVar14 = lVar14 + 8;
                      } while (uVar57 == *puVar21);
                      uVar57 = *puVar21 ^ uVar57;
                      uVar48 = 0;
                      if (uVar57 != 0) {
                        for (; (uVar57 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                        }
                      }
                      uVar57 = (uVar48 >> 3 & 0x1fffffff) + lVar14;
                    }
                    else {
                      uVar48 = *puVar56 ^ *puVar29;
                      uVar57 = 0;
                      if (uVar48 != 0) {
                        for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                        }
                      }
                      uVar57 = uVar57 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0011e0e4:
                    if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                      puVar21 = (ulong *)((long)puVar21 + 4);
                      puVar29 = (ulong *)((long)puVar29 + 4);
                    }
                    if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                      puVar21 = (ulong *)((long)puVar21 + 2);
                      puVar29 = (ulong *)((long)puVar29 + 2);
                    }
                    if (puVar21 < puVar12) {
                      puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar21))
                      ;
                    }
                    uVar57 = (long)puVar21 - (long)puVar56;
                  }
                  pUVar16 = (U32 *)(uVar57 + (long)pUVar16);
                  if (pUVar18 < pUVar16) {
                    iVar66 = uVar44 + (U32)pUVar16;
                    if (pUVar16 <= (U32 *)(ulong)(iVar65 - uVar44)) {
                      iVar66 = iVar65;
                    }
                    iVar65 = iVar66;
                    pZVar2[uVar53].off = (uVar35 + 2) - uVar44;
                    pZVar2[uVar53].len = (U32)pUVar16;
                    uVar52 = (int)uVar53 + 1;
                    uVar53 = (ulong)uVar52;
                    if (((U32 *)0x1000 < pUVar16) ||
                       (pUVar18 = pUVar16, (ulong *)((long)puVar20 + (long)pUVar16) == puVar12))
                    break;
                  }
                  uVar52 = (uint)uVar53;
                  puVar27 = local_f8 + (uVar44 & uVar33) * 2;
                  if ((pBVar32 + uVar46)[(long)pUVar16] < *(byte *)((long)puVar20 + (long)pUVar16))
                  {
                    *local_1f0 = uVar44;
                    if (uVar44 <= uVar28) {
                      local_1f0 = &local_15c;
                      break;
                    }
                    puVar27 = puVar27 + 1;
                    local_1f0 = puVar27;
                    local_190 = pUVar16;
                  }
                  else {
                    *local_208 = uVar44;
                    local_208 = puVar27;
                    pUVar39 = pUVar16;
                    if (uVar44 <= uVar28) {
                      local_208 = &local_15c;
                      break;
                    }
                  }
                  bVar60 = uVar59 == 0;
                  uVar59 = uVar59 - 1;
                  if ((bVar60) || (uVar44 = *puVar27, uVar44 < uVar24)) break;
                } while( true );
              }
              *local_208 = 0;
              *local_1f0 = 0;
              ms->nextToUpdate = iVar65 - 8;
LAB_0011e23c:
              auVar34 = local_118;
            }
            else {
              if (UVar10 == 5) {
                uVar46 = (ulong)(UVar8 != 0);
                uVar59 = (ms->cParams).targetLength;
                if (0xffe < uVar59) {
                  uVar59 = 0xfff;
                }
                pBVar32 = (ms->window).base;
                uVar35 = iVar65 - (int)pBVar32;
                local_150 = ms->hashTable;
                uVar53 = 0;
                local_e8 = *puVar20 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
                local_f8 = ms->chainTable;
                uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                uVar28 = uVar35 - uVar33;
                if (uVar35 < uVar33) {
                  uVar28 = 0;
                }
                local_d8 = (U32 *)CONCAT44(local_d8._4_4_,uVar28);
                UVar10 = (ms->window).lowLimit;
                uVar24 = UVar10 + (UVar10 == 0);
                local_148 = (BYTE *)CONCAT44(local_148._4_4_,uVar33);
                uVar48 = (ulong)((uVar33 & uVar35) * 2);
                local_1f0 = local_f8 + uVar48;
                local_208 = local_f8 + uVar48 + 1;
                UVar10 = (ms->window).dictLimit;
                uVar44 = local_150[local_e8];
                local_108 = (ulong)uVar35;
                iVar65 = uVar35 + 9;
                uVar51 = (ms->cParams).searchLog;
                local_d0 = (ZSTD_optimal_t *)CONCAT44(local_d0._4_4_,uVar51);
                uVar48 = uVar46 + 3;
                puVar29 = (ulong *)((long)puVar20 + 4);
                pUVar18 = local_100;
                do {
                  if (uVar46 == 3) {
                    uVar52 = *(int *)((long)local_118 + 0x10) - 1;
                  }
                  else {
                    uVar52 = *(uint *)((long)local_118 + 0x10 + uVar46 * 4);
                  }
                  pUVar39 = (U32 *)0x0;
                  if ((uVar52 - 1 < uVar35 - UVar10) &&
                     ((uint)*puVar20 == *(uint *)((long)puVar20 - (ulong)uVar52))) {
                    lVar14 = -(ulong)uVar52;
                    puVar21 = (ulong *)((long)puVar29 + lVar14);
                    puVar56 = puVar29;
                    if (puVar29 < puVar58) {
                      if (*puVar21 == *puVar29) {
                        lVar14 = lVar14 + uVar57;
                        lVar55 = 0;
                        do {
                          puVar56 = (ulong *)((long)local_128 + lVar55 + uVar57);
                          if (puVar58 <= puVar56) {
                            puVar21 = (ulong *)((long)local_128 + lVar55 + lVar14);
                            goto LAB_0011dc37;
                          }
                          uVar22 = *(ulong *)((long)local_128 + lVar55 + lVar14);
                          lVar55 = lVar55 + 8;
                        } while (uVar22 == *puVar56);
                        uVar22 = *puVar56 ^ uVar22;
                        uVar50 = 0;
                        if (uVar22 != 0) {
                          for (; (uVar22 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                          }
                        }
                        uVar52 = ((uint)(uVar50 >> 3) & 0x1fffffff) + (int)lVar55;
                      }
                      else {
                        uVar50 = *puVar29 ^ *puVar21;
                        uVar22 = 0;
                        if (uVar50 != 0) {
                          for (; (uVar50 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                          }
                        }
                        uVar52 = (uint)(uVar22 >> 3) & 0x1fffffff;
                      }
                    }
                    else {
LAB_0011dc37:
                      if ((puVar56 < puVar31) && ((uint)*puVar21 == (uint)*puVar56)) {
                        puVar56 = (ulong *)((long)puVar56 + 4);
                        puVar21 = (ulong *)((long)puVar21 + 4);
                      }
                      if ((puVar56 < puVar13) && ((short)*puVar21 == (short)*puVar56)) {
                        puVar56 = (ulong *)((long)puVar56 + 2);
                        puVar21 = (ulong *)((long)puVar21 + 2);
                      }
                      if (puVar56 < puVar12) {
                        puVar56 = (ulong *)((long)puVar56 +
                                           (ulong)((BYTE)*puVar21 == (BYTE)*puVar56));
                      }
                      uVar52 = (int)puVar56 - (int)puVar29;
                    }
                    pUVar39 = (U32 *)(ulong)(uVar52 + 4);
                  }
                  if (pUVar18 < pUVar39) {
                    pZVar2[uVar53].off = (int)uVar46 - (uint)(UVar8 != 0);
                    pZVar2[uVar53].len = (uint)pUVar39;
                    uVar52 = (int)uVar53 + 1;
                    uVar53 = (ulong)uVar52;
                    if ((uVar59 < (uint)pUVar39) ||
                       (pUVar18 = pUVar39, (ulong *)((long)puVar20 + (long)pUVar39) == puVar12))
                    goto LAB_0011e7eb;
                  }
                  uVar52 = (uint)uVar53;
                  uVar46 = uVar46 + 1;
                } while (uVar46 < uVar48);
                local_150[local_e8] = uVar35;
                if (uVar24 <= uVar44) {
                  uVar59 = ~(-1 << ((byte)uVar51 & 0x1f));
                  local_108 = (ulong)(uVar35 + 2);
                  local_150 = (U32 *)(pBVar32 + 8);
                  local_190 = (U32 *)0x0;
                  pUVar39 = (U32 *)0x0;
                  do {
                    uVar46 = (ulong)uVar44;
                    pUVar16 = pUVar39;
                    if (local_190 < pUVar39) {
                      pUVar16 = local_190;
                    }
                    puVar56 = (ulong *)((long)puVar20 + (long)pUVar16);
                    puVar29 = (ulong *)(pBVar32 + uVar46 + (long)pUVar16);
                    puVar21 = puVar56;
                    if (puVar56 < puVar58) {
                      if (*puVar29 == *puVar56) {
                        lVar14 = 0;
                        do {
                          puVar21 = (ulong *)((long)local_120 + (long)pUVar16 + lVar14);
                          if (puVar58 <= puVar21) {
                            puVar29 = (ulong *)((long)local_150 + (long)pUVar16 + lVar14 + uVar46);
                            goto LAB_0011e366;
                          }
                          uVar57 = *(ulong *)((long)local_150 + (long)pUVar16 + lVar14 + uVar46);
                          lVar14 = lVar14 + 8;
                        } while (uVar57 == *puVar21);
                        uVar57 = *puVar21 ^ uVar57;
                        uVar48 = 0;
                        if (uVar57 != 0) {
                          for (; (uVar57 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                          }
                        }
                        uVar57 = (uVar48 >> 3 & 0x1fffffff) + lVar14;
                      }
                      else {
                        uVar48 = *puVar56 ^ *puVar29;
                        uVar57 = 0;
                        if (uVar48 != 0) {
                          for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                          }
                        }
                        uVar57 = uVar57 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_0011e366:
                      if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                        puVar21 = (ulong *)((long)puVar21 + 4);
                        puVar29 = (ulong *)((long)puVar29 + 4);
                      }
                      if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                        puVar21 = (ulong *)((long)puVar21 + 2);
                        puVar29 = (ulong *)((long)puVar29 + 2);
                      }
                      if (puVar21 < puVar12) {
                        puVar21 = (ulong *)((long)puVar21 +
                                           (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                      }
                      uVar57 = (long)puVar21 - (long)puVar56;
                    }
                    pUVar16 = (U32 *)(uVar57 + (long)pUVar16);
                    if (pUVar18 < pUVar16) {
                      iVar66 = uVar44 + (U32)pUVar16;
                      if (pUVar16 <= (U32 *)(ulong)(iVar65 - uVar44)) {
                        iVar66 = iVar65;
                      }
                      iVar65 = iVar66;
                      pZVar2[uVar53].off = (uVar35 + 2) - uVar44;
                      pZVar2[uVar53].len = (U32)pUVar16;
                      uVar52 = (int)uVar53 + 1;
                      uVar53 = (ulong)uVar52;
                      if (((U32 *)0x1000 < pUVar16) ||
                         (pUVar18 = pUVar16, (ulong *)((long)puVar20 + (long)pUVar16) == puVar12))
                      break;
                    }
                    uVar52 = (uint)uVar53;
                    puVar27 = local_f8 + (uVar44 & uVar33) * 2;
                    if ((pBVar32 + uVar46)[(long)pUVar16] < *(byte *)((long)puVar20 + (long)pUVar16)
                       ) {
                      *local_1f0 = uVar44;
                      if (uVar44 <= uVar28) {
                        local_1f0 = &local_15c;
                        break;
                      }
                      puVar27 = puVar27 + 1;
                      local_1f0 = puVar27;
                      local_190 = pUVar16;
                    }
                    else {
                      *local_208 = uVar44;
                      local_208 = puVar27;
                      pUVar39 = pUVar16;
                      if (uVar44 <= uVar28) {
                        local_208 = &local_15c;
                        break;
                      }
                    }
                    bVar60 = uVar59 == 0;
                    uVar59 = uVar59 - 1;
                    if ((bVar60) || (uVar44 = *puVar27, uVar44 < uVar24)) break;
                  } while( true );
                }
                *local_208 = 0;
                *local_1f0 = 0;
                ms->nextToUpdate = iVar65 - 8;
              }
              else {
                if (UVar10 == 3) {
                  uVar46 = (ulong)(UVar8 != 0);
                  uVar59 = (ms->cParams).targetLength;
                  if (0xffe < uVar59) {
                    uVar59 = 0xfff;
                  }
                  local_148 = (ms->window).base;
                  uVar28 = iVar65 - (int)local_148;
                  uVar53 = 0;
                  local_48 = (ulong)((uint)*puVar20 * -0x61c8864f >>
                                    (-(char)(ms->cParams).hashLog & 0x1fU));
                  local_d8 = ms->chainTable;
                  uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                  iVar65 = uVar28 - uVar33;
                  if (uVar28 < uVar33) {
                    iVar65 = 0;
                  }
                  local_150._4_4_ = (undefined4)((ulong)local_150 >> 0x20);
                  local_150 = (U32 *)CONCAT44(local_150._4_4_,iVar65);
                  UVar10 = (ms->window).lowLimit;
                  uVar35 = UVar10 + (UVar10 == 0);
                  local_108._4_4_ = (undefined4)(local_108 >> 0x20);
                  local_108 = CONCAT44(local_108._4_4_,uVar33);
                  uVar48 = (ulong)((uVar33 & uVar28) * 2);
                  local_f8 = local_d8 + uVar48;
                  local_180 = local_d8 + uVar48 + 1;
                  UVar10 = (ms->window).dictLimit;
                  local_40 = ms->hashTable;
                  local_d0 = (ZSTD_optimal_t *)(ulong)ms->hashTable[local_48];
                  local_e8 = (ulong)uVar28;
                  iVar65 = uVar28 + 9;
                  local_54 = (ms->cParams).searchLog;
                  uVar48 = uVar46 + 3;
                  puVar29 = (ulong *)((long)puVar20 + 3);
                  local_1e8 = local_100;
                  do {
                    if (uVar46 == 3) {
                      uVar33 = *(int *)((long)local_118 + 0x10) - 1;
                    }
                    else {
                      uVar33 = *(uint *)((long)local_118 + 0x10 + uVar46 * 4);
                    }
                    pUVar18 = (U32 *)0x0;
                    if ((uVar33 - 1 < uVar28 - UVar10) &&
                       (((*(uint *)((long)puVar20 - (ulong)uVar33) ^ (uint)*puVar20) & 0xffffff) ==
                        0)) {
                      lVar14 = -(ulong)uVar33;
                      puVar21 = (ulong *)((long)puVar29 + lVar14);
                      puVar56 = puVar29;
                      if (puVar29 < puVar58) {
                        if (*puVar21 == *puVar29) {
                          lVar14 = lVar14 + uVar57 + local_70;
                          lVar55 = 0;
                          do {
                            puVar56 = (ulong *)(uVar57 + local_70 + lVar55);
                            if (puVar58 <= puVar56) {
                              puVar21 = (ulong *)(lVar14 + lVar55);
                              goto LAB_0011d601;
                            }
                            uVar22 = *(ulong *)(lVar14 + lVar55);
                            lVar55 = lVar55 + 8;
                          } while (uVar22 == *puVar56);
                          uVar22 = *puVar56 ^ uVar22;
                          uVar50 = 0;
                          if (uVar22 != 0) {
                            for (; (uVar22 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                            }
                          }
                          uVar33 = ((uint)(uVar50 >> 3) & 0x1fffffff) + (int)lVar55;
                        }
                        else {
                          uVar50 = *puVar29 ^ *puVar21;
                          uVar22 = 0;
                          if (uVar50 != 0) {
                            for (; (uVar50 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                            }
                          }
                          uVar33 = (uint)(uVar22 >> 3) & 0x1fffffff;
                        }
                      }
                      else {
LAB_0011d601:
                        if ((puVar56 < puVar31) && ((uint)*puVar21 == (uint)*puVar56)) {
                          puVar56 = (ulong *)((long)puVar56 + 4);
                          puVar21 = (ulong *)((long)puVar21 + 4);
                        }
                        if ((puVar56 < puVar13) && ((short)*puVar21 == (short)*puVar56)) {
                          puVar56 = (ulong *)((long)puVar56 + 2);
                          puVar21 = (ulong *)((long)puVar21 + 2);
                        }
                        if (puVar56 < puVar12) {
                          puVar56 = (ulong *)((long)puVar56 +
                                             (ulong)((BYTE)*puVar21 == (BYTE)*puVar56));
                        }
                        uVar33 = (int)puVar56 - (int)puVar29;
                      }
                      pUVar18 = (U32 *)(ulong)(uVar33 + 3);
                    }
                    if (local_1e8 < pUVar18) {
                      pZVar2[uVar53].off = (int)uVar46 - (uint)(UVar8 != 0);
                      pZVar2[uVar53].len = (uint)pUVar18;
                      uVar52 = (int)uVar53 + 1;
                      uVar53 = (ulong)uVar52;
                      if ((uVar59 < (uint)pUVar18) ||
                         (local_1e8 = pUVar18, (ulong *)((long)puVar20 + (long)pUVar18) == puVar12))
                      goto LAB_0011ec02;
                    }
                    uVar46 = uVar46 + 1;
                  } while (uVar46 < uVar48);
                  if (local_1e8 < (U32 *)0x3) {
                    UVar10 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar20);
                    uVar28 = (uint)local_e8;
                    if ((UVar10 < uVar35) || (0x3ffff < uVar28 - UVar10)) goto LAB_0011e8b1;
                    uVar46 = (ulong)UVar10;
                    puVar29 = (ulong *)(local_148 + uVar46);
                    puVar21 = puVar20;
                    if (puVar20 < puVar58) {
                      if (*puVar29 == *puVar20) {
                        lVar14 = 0;
                        do {
                          puVar21 = (ulong *)((long)local_120 + lVar14);
                          if (puVar58 <= puVar21) {
                            puVar29 = (ulong *)(local_148 + lVar14 + uVar46 + 8);
                            goto LAB_0011e825;
                          }
                          lVar55 = lVar14 + uVar46 + 8;
                          lVar14 = lVar14 + 8;
                        } while (*(ulong *)(local_148 + lVar55) == *puVar21);
                        uVar57 = *puVar21 ^ *(ulong *)(local_148 + lVar55);
                        uVar46 = 0;
                        if (uVar57 != 0) {
                          for (; (uVar57 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                          }
                        }
                        pUVar18 = (U32 *)((uVar46 >> 3 & 0x1fffffff) + lVar14);
                      }
                      else {
                        uVar57 = *puVar20 ^ *puVar29;
                        uVar46 = 0;
                        if (uVar57 != 0) {
                          for (; (uVar57 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                          }
                        }
                        pUVar18 = (U32 *)(uVar46 >> 3 & 0x1fffffff);
                      }
                    }
                    else {
LAB_0011e825:
                      if ((puVar21 < puVar31) && ((uint)*puVar29 == (uint)*puVar21)) {
                        puVar21 = (ulong *)((long)puVar21 + 4);
                        puVar29 = (ulong *)((long)puVar29 + 4);
                      }
                      if ((puVar21 < puVar13) && ((short)*puVar29 == (short)*puVar21)) {
                        puVar21 = (ulong *)((long)puVar21 + 2);
                        puVar29 = (ulong *)((long)puVar29 + 2);
                      }
                      if (puVar21 < puVar12) {
                        puVar21 = (ulong *)((long)puVar21 +
                                           (ulong)((BYTE)*puVar29 == (BYTE)*puVar21));
                      }
                      pUVar18 = (U32 *)((long)puVar21 - (long)puVar20);
                    }
                    if (pUVar18 < (U32 *)0x3) goto LAB_0011e8b1;
                    pZVar2->off = (uVar28 - UVar10) + 2;
                    pZVar2->len = (U32)pUVar18;
                    if ((pUVar18 <= (U32 *)(ulong)uVar59) &&
                       (uVar53 = 1, local_1e8 = pUVar18,
                       (ulong *)((long)puVar20 + (long)pUVar18) != puVar12)) goto LAB_0011e8b1;
                    UVar10 = uVar28 + 1;
                    uVar52 = 1;
                  }
                  else {
LAB_0011e8b1:
                    uVar52 = (uint)uVar53;
                    local_40[local_48] = uVar28;
                    if (uVar35 <= (uint)local_d0) {
                      uVar59 = ~(-1 << ((byte)local_54 & 0x1f));
                      local_e8 = (ulong)(uVar28 + 2);
                      pUVar18 = (U32 *)0x0;
                      local_190 = (U32 *)0x0;
                      uVar46 = (ulong)local_d0;
                      do {
                        pUVar39 = local_190;
                        if (pUVar18 < local_190) {
                          pUVar39 = pUVar18;
                        }
                        uVar33 = (uint)uVar46;
                        uVar46 = uVar46 & 0xffffffff;
                        puVar29 = (ulong *)((long)puVar20 + (long)pUVar39);
                        puVar21 = (ulong *)(local_148 + uVar46 + (long)pUVar39);
                        puVar56 = puVar29;
                        if (puVar29 < puVar58) {
                          if (*puVar21 == *puVar29) {
                            lVar14 = 0;
                            do {
                              puVar56 = (ulong *)(lVar14 + (long)local_120 + (long)pUVar39);
                              auVar34 = local_118;
                              if (puVar58 <= puVar56) {
                                puVar21 = (ulong *)(local_148 + (long)pUVar39 + lVar14 + 8 + uVar46)
                                ;
                                goto LAB_0011ea25;
                              }
                              lVar55 = lVar14 + uVar46 + 8;
                              lVar14 = lVar14 + 8;
                            } while (*(ulong *)(local_148 + (long)pUVar39 + lVar55) == *puVar56);
                            uVar48 = *puVar56 ^ *(ulong *)(local_148 + (long)pUVar39 + lVar55);
                            uVar57 = 0;
                            if (uVar48 != 0) {
                              for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                              }
                            }
                            uVar57 = (uVar57 >> 3 & 0x1fffffff) + lVar14;
                          }
                          else {
                            uVar48 = *puVar29 ^ *puVar21;
                            uVar57 = 0;
                            if (uVar48 != 0) {
                              for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                              }
                            }
                            uVar57 = uVar57 >> 3 & 0x1fffffff;
                          }
                        }
                        else {
LAB_0011ea25:
                          if ((puVar56 < puVar31) && ((uint)*puVar21 == (uint)*puVar56)) {
                            puVar56 = (ulong *)((long)puVar56 + 4);
                            puVar21 = (ulong *)((long)puVar21 + 4);
                          }
                          if ((puVar56 < puVar13) && ((short)*puVar21 == (short)*puVar56)) {
                            puVar56 = (ulong *)((long)puVar56 + 2);
                            puVar21 = (ulong *)((long)puVar21 + 2);
                          }
                          if (puVar56 < puVar12) {
                            puVar56 = (ulong *)((long)puVar56 +
                                               (ulong)((BYTE)*puVar21 == (BYTE)*puVar56));
                          }
                          uVar57 = (long)puVar56 - (long)puVar29;
                        }
                        pUVar39 = (U32 *)(uVar57 + (long)pUVar39);
                        if (local_1e8 < pUVar39) {
                          iVar66 = uVar33 + (U32)pUVar39;
                          if (pUVar39 <= (U32 *)(ulong)(iVar65 - uVar33)) {
                            iVar66 = iVar65;
                          }
                          iVar65 = iVar66;
                          pZVar2[uVar53].off = (uVar28 + 2) - uVar33;
                          pZVar2[uVar53].len = (U32)pUVar39;
                          uVar52 = (int)uVar53 + 1;
                          uVar53 = (ulong)uVar52;
                          if (((U32 *)0x1000 < pUVar39) ||
                             (local_1e8 = pUVar39,
                             (ulong *)((long)pUVar39 + (long)puVar20) == puVar12)) break;
                        }
                        uVar52 = (uint)uVar53;
                        puVar27 = local_d8 + (uVar33 & (uint)local_108) * 2;
                        if ((local_148 + uVar46)[(long)pUVar39] <
                            *(byte *)((long)puVar20 + (long)pUVar39)) {
                          *local_f8 = uVar33;
                          if (uVar33 <= (uint)local_150) {
                            local_f8 = &local_15c;
                            break;
                          }
                          puVar27 = puVar27 + 1;
                          local_f8 = puVar27;
                          pUVar18 = pUVar39;
                        }
                        else {
                          *local_180 = uVar33;
                          local_180 = puVar27;
                          local_190 = pUVar39;
                          if (uVar33 <= (uint)local_150) {
                            local_180 = &local_15c;
                            break;
                          }
                        }
                        bVar60 = uVar59 == 0;
                        uVar59 = uVar59 - 1;
                        if ((bVar60) || (uVar46 = (ulong)*puVar27, *puVar27 < uVar35)) break;
                      } while( true );
                    }
                    *local_180 = 0;
                    *local_f8 = 0;
                    UVar10 = iVar65 - 8;
                  }
                  ms->nextToUpdate = UVar10;
                  goto LAB_0011ec02;
                }
                uVar46 = (ulong)(UVar8 != 0);
                uVar59 = (ms->cParams).targetLength;
                if (0xffe < uVar59) {
                  uVar59 = 0xfff;
                }
                pBVar32 = (ms->window).base;
                uVar35 = iVar65 - (int)pBVar32;
                local_150 = ms->hashTable;
                uVar53 = 0;
                local_e8 = (ulong)((uint)*puVar20 * -0x61c8864f >>
                                  (-(char)(ms->cParams).hashLog & 0x1fU));
                local_f8 = ms->chainTable;
                uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                uVar28 = uVar35 - uVar33;
                if (uVar35 < uVar33) {
                  uVar28 = 0;
                }
                local_d8 = (U32 *)CONCAT44(local_d8._4_4_,uVar28);
                UVar10 = (ms->window).lowLimit;
                uVar24 = UVar10 + (UVar10 == 0);
                local_148 = (BYTE *)CONCAT44(local_148._4_4_,uVar33);
                uVar48 = (ulong)((uVar33 & uVar35) * 2);
                local_1f0 = local_f8 + uVar48;
                puVar27 = local_f8 + uVar48 + 1;
                UVar10 = (ms->window).dictLimit;
                uVar44 = local_150[local_e8];
                local_108 = (ulong)uVar35;
                iVar65 = uVar35 + 9;
                uVar51 = (ms->cParams).searchLog;
                local_d0 = (ZSTD_optimal_t *)CONCAT44(local_d0._4_4_,uVar51);
                uVar48 = uVar46 + 3;
                puVar29 = (ulong *)((long)puVar20 + 4);
                pUVar18 = local_100;
                do {
                  if (uVar46 == 3) {
                    uVar52 = *(int *)((long)local_118 + 0x10) - 1;
                  }
                  else {
                    uVar52 = *(uint *)((long)local_118 + 0x10 + uVar46 * 4);
                  }
                  pUVar39 = (U32 *)0x0;
                  if ((uVar52 - 1 < uVar35 - UVar10) &&
                     ((uint)*puVar20 == *(uint *)((long)puVar20 - (ulong)uVar52))) {
                    lVar14 = -(ulong)uVar52;
                    puVar21 = (ulong *)((long)puVar29 + lVar14);
                    puVar56 = puVar29;
                    if (puVar29 < puVar58) {
                      if (*puVar21 == *puVar29) {
                        lVar14 = lVar14 + uVar57;
                        lVar55 = 0;
                        do {
                          puVar56 = (ulong *)((long)local_128 + lVar55 + uVar57);
                          if (puVar58 <= puVar56) {
                            puVar21 = (ulong *)((long)local_128 + lVar55 + lVar14);
                            goto LAB_0011deed;
                          }
                          uVar22 = *(ulong *)((long)local_128 + lVar55 + lVar14);
                          lVar55 = lVar55 + 8;
                        } while (uVar22 == *puVar56);
                        uVar22 = *puVar56 ^ uVar22;
                        uVar50 = 0;
                        if (uVar22 != 0) {
                          for (; (uVar22 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                          }
                        }
                        uVar52 = ((uint)(uVar50 >> 3) & 0x1fffffff) + (int)lVar55;
                      }
                      else {
                        uVar50 = *puVar29 ^ *puVar21;
                        uVar22 = 0;
                        if (uVar50 != 0) {
                          for (; (uVar50 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                          }
                        }
                        uVar52 = (uint)(uVar22 >> 3) & 0x1fffffff;
                      }
                    }
                    else {
LAB_0011deed:
                      if ((puVar56 < puVar31) && ((uint)*puVar21 == (uint)*puVar56)) {
                        puVar56 = (ulong *)((long)puVar56 + 4);
                        puVar21 = (ulong *)((long)puVar21 + 4);
                      }
                      if ((puVar56 < puVar13) && ((short)*puVar21 == (short)*puVar56)) {
                        puVar56 = (ulong *)((long)puVar56 + 2);
                        puVar21 = (ulong *)((long)puVar21 + 2);
                      }
                      if (puVar56 < puVar12) {
                        puVar56 = (ulong *)((long)puVar56 +
                                           (ulong)((BYTE)*puVar21 == (BYTE)*puVar56));
                      }
                      uVar52 = (int)puVar56 - (int)puVar29;
                    }
                    pUVar39 = (U32 *)(ulong)(uVar52 + 4);
                  }
                  if (pUVar18 < pUVar39) {
                    pZVar2[uVar53].off = (int)uVar46 - (uint)(UVar8 != 0);
                    pZVar2[uVar53].len = (uint)pUVar39;
                    uVar52 = (int)uVar53 + 1;
                    uVar53 = (ulong)uVar52;
                    if ((uVar59 < (uint)pUVar39) ||
                       (pUVar18 = pUVar39, (ulong *)((long)puVar20 + (long)pUVar39) == puVar12))
                    goto LAB_0011e7eb;
                  }
                  uVar52 = (uint)uVar53;
                  uVar46 = uVar46 + 1;
                } while (uVar46 < uVar48);
                local_150[local_e8] = uVar35;
                if (uVar24 <= uVar44) {
                  uVar59 = ~(-1 << ((byte)uVar51 & 0x1f));
                  local_108 = (ulong)(uVar35 + 2);
                  local_150 = (U32 *)(pBVar32 + 8);
                  local_1e8 = (U32 *)0x0;
                  local_190 = (U32 *)0x0;
                  local_208 = puVar27;
                  do {
                    uVar46 = (ulong)uVar44;
                    pUVar39 = local_190;
                    if (local_1e8 < local_190) {
                      pUVar39 = local_1e8;
                    }
                    puVar29 = (ulong *)((long)puVar20 + (long)pUVar39);
                    puVar21 = (ulong *)(pBVar32 + uVar46 + (long)pUVar39);
                    puVar56 = puVar29;
                    if (puVar29 < puVar58) {
                      if (*puVar21 == *puVar29) {
                        lVar14 = 0;
                        do {
                          puVar56 = (ulong *)((long)local_120 + (long)pUVar39 + lVar14);
                          if (puVar58 <= puVar56) {
                            puVar21 = (ulong *)((long)local_150 + (long)pUVar39 + lVar14 + uVar46);
                            goto LAB_0011e5bb;
                          }
                          uVar57 = *(ulong *)((long)local_150 + (long)pUVar39 + lVar14 + uVar46);
                          lVar14 = lVar14 + 8;
                        } while (uVar57 == *puVar56);
                        uVar57 = *puVar56 ^ uVar57;
                        uVar48 = 0;
                        if (uVar57 != 0) {
                          for (; (uVar57 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                          }
                        }
                        uVar57 = (uVar48 >> 3 & 0x1fffffff) + lVar14;
                      }
                      else {
                        uVar48 = *puVar29 ^ *puVar21;
                        uVar57 = 0;
                        if (uVar48 != 0) {
                          for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                          }
                        }
                        uVar57 = uVar57 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_0011e5bb:
                      if ((puVar56 < puVar31) && ((uint)*puVar21 == (uint)*puVar56)) {
                        puVar56 = (ulong *)((long)puVar56 + 4);
                        puVar21 = (ulong *)((long)puVar21 + 4);
                      }
                      if ((puVar56 < puVar13) && ((short)*puVar21 == (short)*puVar56)) {
                        puVar56 = (ulong *)((long)puVar56 + 2);
                        puVar21 = (ulong *)((long)puVar21 + 2);
                      }
                      if (puVar56 < puVar12) {
                        puVar56 = (ulong *)((long)puVar56 +
                                           (ulong)((BYTE)*puVar21 == (BYTE)*puVar56));
                      }
                      uVar57 = (long)puVar56 - (long)puVar29;
                    }
                    pUVar39 = (U32 *)(uVar57 + (long)pUVar39);
                    puVar27 = local_208;
                    if (pUVar18 < pUVar39) {
                      iVar66 = uVar44 + (U32)pUVar39;
                      if (pUVar39 <= (U32 *)(ulong)(iVar65 - uVar44)) {
                        iVar66 = iVar65;
                      }
                      iVar65 = iVar66;
                      pZVar2[uVar53].off = (uVar35 + 2) - uVar44;
                      pZVar2[uVar53].len = (U32)pUVar39;
                      uVar52 = (int)uVar53 + 1;
                      uVar53 = (ulong)uVar52;
                      if (((U32 *)0x1000 < pUVar39) ||
                         (pUVar18 = pUVar39, (ulong *)((long)puVar20 + (long)pUVar39) == puVar12))
                      break;
                    }
                    uVar52 = (uint)uVar53;
                    puVar27 = local_f8 + (uVar44 & uVar33) * 2;
                    if ((pBVar32 + uVar46)[(long)pUVar39] < *(byte *)((long)puVar20 + (long)pUVar39)
                       ) {
                      *local_1f0 = uVar44;
                      if (uVar44 <= uVar28) {
                        local_1f0 = &local_15c;
                        puVar27 = local_208;
                        break;
                      }
                      local_1f0 = puVar27 + 1;
                      puVar27 = local_208;
                      puVar26 = local_1f0;
                      local_1e8 = pUVar39;
                    }
                    else {
                      *local_208 = uVar44;
                      puVar26 = puVar27;
                      local_190 = pUVar39;
                      if (uVar44 <= uVar28) {
                        puVar27 = &local_15c;
                        break;
                      }
                    }
                    bVar60 = uVar59 == 0;
                    uVar59 = uVar59 - 1;
                    if ((bVar60) || (uVar44 = *puVar26, local_208 = puVar27, uVar44 < uVar24))
                    break;
                  } while( true );
                }
                *puVar27 = 0;
                *local_1f0 = 0;
                ms->nextToUpdate = iVar65 - 8;
              }
LAB_0011e7eb:
              auVar34 = local_118;
            }
LAB_0011ec02:
            if (uVar52 != 0) {
              uVar59 = pZVar2[uVar52 - 1].len;
              if (((uint)local_80 < uVar59) || (0xfff < uVar59 + iVar9)) {
                iVar64 = 0;
                if (*(int *)((long)auVar34 + 8) == 0) {
                  iVar64 = *(int *)((long)auVar34 + 0xc);
                }
                UVar8 = pZVar2[uVar52 - 1].off;
                uVar33 = iVar9 - iVar64;
                if (0x1000 < (uint)(iVar9 - iVar64)) {
                  uVar33 = 0;
                }
                uVar15 = (ulong)uVar33;
                goto LAB_0011efc5;
              }
              local_118 = (undefined1  [8])((long)local_60 + (long)pZVar17 + 0x10);
              uVar46 = 0;
              do {
                UVar10 = pZVar2[uVar46].off;
                rVar72 = ZSTD_updateRep((U32 *)local_118,UVar10,(uint)(UVar8 != 0));
                auVar63 = _DAT_0015dce0;
                auVar62 = _DAT_0015dcd0;
                auVar61 = _DAT_0015c8b0;
                uVar59 = uVar6;
                if (uVar46 != 0) {
                  uVar59 = pZVar2[uVar46 - 1].len + 1;
                }
                uVar33 = pZVar2[uVar46].len;
                if (uVar59 <= uVar33) {
                  uVar28 = 0x1f;
                  if (UVar10 + 1 != 0) {
                    for (; UVar10 + 1 >> uVar28 == 0; uVar28 = uVar28 - 1) {
                    }
                  }
                  uVar35 = iVar9 + uVar33;
                  do {
                    uVar57 = (ulong)uVar35;
                    if ((ms->opt).priceType == zop_predef) {
                      uVar51 = uVar33 - 2;
                      iVar65 = 0x1f;
                      if (uVar51 != 0) {
                        for (; uVar51 >> iVar65 == 0; iVar65 = iVar65 + -1) {
                        }
                      }
                      iVar65 = (iVar65 + uVar28) * 0x100 + (uVar51 * 0x100 >> ((byte)iVar65 & 0x1f))
                               + 0x1000;
                    }
                    else {
                      uVar51 = uVar33 - 3;
                      uVar44 = (ms->opt).offCodeFreq[uVar28] + 1;
                      iVar65 = 0x1f;
                      if (uVar44 != 0) {
                        for (; uVar44 >> iVar65 == 0; iVar65 = iVar65 + -1) {
                        }
                      }
                      if (uVar51 < 0x80) {
                        uVar51 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar51];
                      }
                      else {
                        uVar24 = 0x1f;
                        if (uVar51 != 0) {
                          for (; uVar51 >> uVar24 == 0; uVar24 = uVar24 - 1) {
                          }
                        }
                        uVar51 = (uVar24 ^ 0xffffffe0) + 0x44;
                      }
                      uVar24 = (ms->opt).matchLengthFreq[uVar51] + 1;
                      iVar66 = 0x1f;
                      if (uVar24 != 0) {
                        for (; uVar24 >> iVar66 == 0; iVar66 = iVar66 + -1) {
                        }
                      }
                      iVar65 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice)
                               - ((uVar44 * 0x100 >> ((byte)iVar65 & 0x1f)) +
                                 (uVar24 * 0x100 >> ((byte)iVar66 & 0x1f)))) +
                               ((ML_bits[uVar51] + uVar28) - (iVar65 + iVar66)) * 0x100 + 0x33;
                      pZVar17 = local_158;
                    }
                    iVar65 = iVar65 + UVar7 + iVar64;
                    uVar51 = uVar33 + iVar9;
                    if ((uint)uVar15 < uVar51) {
                      uVar15 = uVar15 & 0xffffffff;
                      lVar14 = ~uVar15 + uVar57;
                      auVar67._8_4_ = (int)lVar14;
                      auVar67._0_8_ = lVar14;
                      auVar67._12_4_ = (int)((ulong)lVar14 >> 0x20);
                      pZVar54 = local_78 + uVar15;
                      uVar53 = 0;
                      do {
                        auVar68._8_4_ = (int)uVar53;
                        auVar68._0_8_ = uVar53;
                        auVar68._12_4_ = (int)(uVar53 >> 0x20);
                        auVar69 = (auVar68 | auVar63) ^ auVar61;
                        iVar66 = SUB164(auVar67 ^ auVar61,0);
                        bVar60 = iVar66 < auVar69._0_4_;
                        iVar70 = SUB164(auVar67 ^ auVar61,4);
                        iVar71 = auVar69._4_4_;
                        if ((bool)(~(iVar70 < iVar71 || iVar71 == iVar70 && bVar60) & 1)) {
                          pZVar54[-3].price = 0x40000000;
                        }
                        if (iVar70 >= iVar71 && (iVar71 != iVar70 || !bVar60)) {
                          pZVar54[-2].price = 0x40000000;
                        }
                        auVar69 = (auVar68 | auVar62) ^ auVar61;
                        iVar71 = auVar69._4_4_;
                        if (iVar71 <= iVar70 && (iVar71 != iVar70 || auVar69._0_4_ <= iVar66)) {
                          pZVar54[-1].price = 0x40000000;
                          pZVar54->price = 0x40000000;
                        }
                        uVar53 = uVar53 + 4;
                        pZVar54 = pZVar54 + 4;
                      } while (((uVar57 - uVar15) + 3 & 0xfffffffffffffffc) != uVar53);
LAB_0011ef05:
                      pZVar17[uVar51].mlen = uVar33;
                      pZVar17[uVar51].off = UVar10;
                      pZVar17[uVar51].litlen = UVar23;
                      pZVar17[uVar51].price = iVar65;
                      *(long *)pZVar17[uVar51].rep = rVar72.rep._0_8_;
                      pZVar17[uVar51].rep[2] = rVar72.rep[2];
                      uVar15 = uVar57;
                    }
                    else {
                      uVar57 = uVar15;
                      if (iVar65 < pZVar17[uVar51].price) goto LAB_0011ef05;
                    }
                    uVar33 = uVar33 - 1;
                    uVar35 = uVar35 - 1;
                  } while (uVar59 <= uVar33);
                }
                uVar46 = uVar46 + 1;
              } while (uVar46 != uVar52);
            }
          }
        }
        uVar57 = (ulong)(iVar9 + 1U);
        uVar46 = uVar15;
      } while (iVar9 + 1U <= (uint)uVar15);
    }
    uVar15 = uVar46 & 0xffffffff;
    local_1c0._0_4_ = pZVar17[uVar15].price;
    UVar8 = pZVar17[uVar15].off;
    uVar59 = pZVar17[uVar15].mlen;
    UVar23 = pZVar17[uVar15].litlen;
    local_88 = pZVar17[uVar15].rep[2];
    local_90 = *(undefined8 *)pZVar17[uVar15].rep;
    uVar15 = (ulong)((uint)uVar46 - (UVar23 + uVar59));
    if ((uint)uVar46 < UVar23 + uVar59) {
      uVar15 = 0;
    }
  }
LAB_0011efc5:
  uVar33 = (int)uVar15 + 1;
  pZVar17[uVar33].price = (int)local_1c0;
  pZVar17[uVar33].off = UVar8;
  pZVar17[uVar33].mlen = uVar59;
  pZVar17[uVar33].litlen = UVar23;
  *(undefined8 *)pZVar17[uVar33].rep = local_90;
  pZVar17[uVar33].rep[2] = local_88;
  uVar46 = uVar15;
  poVar37 = local_f0;
  if ((int)uVar15 == 0) {
    uVar57 = 1;
LAB_0011f082:
    local_1e0 = local_140 & 0xffffffff;
    local_1d0 = local_140 >> 0x20;
    do {
      uVar59 = local_158[uVar57].litlen;
      uVar15 = (ulong)uVar59;
      UVar23 = local_158[uVar57].mlen;
      if (UVar23 == 0) {
        puVar38 = (ulong *)(uVar15 + (long)puVar30);
      }
      else {
        uVar28 = local_158[uVar57].off;
        if (uVar28 < 3) {
          uVar35 = (uVar15 == 0) + uVar28;
          if (uVar35 != 0) {
            if (uVar35 == 3) {
              uVar46 = (ulong)((int)local_1e0 - 1);
LAB_0011f12c:
              local_138 = (U32)local_1d0;
            }
            else {
              uVar46 = (ulong)*(uint *)((long)&local_140 + (ulong)uVar35 * 4);
              if (uVar35 != 1) goto LAB_0011f12c;
            }
            uVar35 = (uint)uVar46;
            goto LAB_0011f14e;
          }
        }
        else {
          local_138 = (U32)local_1d0;
          uVar35 = uVar28 - 2;
          uVar46 = (ulong)uVar35;
LAB_0011f14e:
          local_140 = CONCAT44((int)local_1e0,uVar35);
          local_1d0 = local_1e0;
          local_1e0 = uVar46;
        }
        ZSTD_updateStats(poVar37,uVar59,(BYTE *)puVar30,uVar28,UVar23);
        puVar20 = (ulong *)local_98->lit;
        puVar38 = (ulong *)((long)puVar20 + uVar15);
        puVar29 = puVar30;
        do {
          *puVar20 = *puVar29;
          puVar20 = puVar20 + 1;
          puVar29 = puVar29 + 1;
        } while (puVar20 < puVar38);
        local_98->lit = local_98->lit + uVar15;
        if (uVar59 < 0x10000) {
          psVar19 = local_98->sequences;
        }
        else {
          local_98->longLengthID = 1;
          psVar19 = local_98->sequences;
          local_98->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)local_98->sequencesStart) >> 3);
        }
        psVar19->litLength = (U16)uVar59;
        psVar19->offset = uVar28 + 1;
        if (0xffff < UVar23 - 3) {
          local_98->longLengthID = 2;
          local_98->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)local_98->sequencesStart) >> 3);
        }
        psVar19->matchLength = (U16)(UVar23 - 3);
        local_98->sequences = psVar19 + 1;
        puVar38 = (ulong *)((long)puVar30 + (ulong)(UVar23 + uVar59));
        poVar37 = local_f0;
        puVar30 = puVar38;
      }
      uVar59 = (int)uVar57 + 1;
      uVar57 = (ulong)uVar59;
    } while (uVar59 <= uVar33);
  }
  else {
    do {
      uVar57 = uVar46;
      uVar59 = (uint)uVar15;
      uVar28 = pZVar17[uVar15].litlen + pZVar17[uVar15].mlen;
      pZVar54 = pZVar17 + uVar15;
      iVar9 = pZVar54->price;
      UVar10 = pZVar54->off;
      UVar11 = pZVar54->mlen;
      UVar5 = pZVar54->litlen;
      pZVar54 = pZVar17 + uVar15;
      UVar23 = pZVar54->rep[0];
      UVar8 = pZVar54->rep[1];
      UVar7 = pZVar54->rep[2];
      pZVar1 = pZVar17 + uVar57;
      pZVar1->litlen = pZVar54->litlen;
      pZVar1->rep[0] = UVar23;
      pZVar1->rep[1] = UVar8;
      pZVar1->rep[2] = UVar7;
      pZVar54 = pZVar17 + uVar57;
      pZVar54->price = iVar9;
      pZVar54->off = UVar10;
      pZVar54->mlen = UVar11;
      pZVar54->litlen = UVar5;
      uVar15 = (ulong)(uVar59 - uVar28);
      if (uVar28 > uVar59) {
        uVar15 = 0;
      }
      uVar46 = (ulong)((uint)uVar57 - 1);
    } while (uVar28 <= uVar59 && uVar59 - uVar28 != 0);
    if ((uint)uVar57 <= uVar33) goto LAB_0011f082;
  }
  ZSTD_setBasePrices(poVar37,2);
  ssPtr = local_98;
LAB_0011f22c:
  if (local_a0 <= puVar38) goto LAB_0011f369;
  goto LAB_0011b98a;
LAB_00122a84:
  local_218 = (uint *)&local_140;
  goto LAB_00120068;
LAB_00122a91:
  local_200 = (uint *)&local_140;
LAB_00120068:
  *local_218 = 0;
  *local_200 = 0;
  ms->nextToUpdate = iVar9 - 8;
LAB_0012033b:
  pUVar18 = local_e0;
  poVar37 = local_f0;
  pZVar17 = local_158;
  puVar31 = local_130;
  if (uVar51 == 0) {
LAB_001203f0:
    puVar30 = (ulong *)((long)puVar30 + 1);
  }
  else {
    lVar14 = 0;
    do {
      local_158->rep[lVar14] = local_e0[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    local_158->mlen = 0;
    local_158->litlen = UVar23;
    iVar9 = ZSTD_literalsContribution((BYTE *)local_130,UVar23,local_f0,2);
    pZVar17->price = iVar9;
    uVar6 = pZVar2[uVar51 - 1].len;
    if ((uint)local_108 < uVar6) {
      UVar7 = pZVar2[uVar51 - 1].off;
      puVar31 = local_130;
      uVar33 = 0;
LAB_001203e6:
      pZVar17 = local_158;
    }
    else {
      UVar8 = ZSTD_litLengthPrice(0,poVar37,2);
      auVar62 = _DAT_0015dce0;
      auVar61 = _DAT_0015dcd0;
      uVar46 = 0;
      pZVar17 = local_d0;
      do {
        auVar63._8_4_ = (int)uVar46;
        auVar63._0_8_ = uVar46;
        auVar63._12_4_ = (int)(uVar46 >> 0x20);
        auVar69 = (auVar63 | auVar62) ^ _DAT_0015c8b0;
        if ((bool)(~(auVar69._4_4_ == local_118._4_4_ && (int)local_118._0_4_ < auVar69._0_4_ ||
                    (int)local_118._4_4_ < auVar69._4_4_) & 1)) {
          pZVar17[-3].price = 0x40000000;
        }
        if ((auVar69._12_4_ != iStack_10c || auVar69._8_4_ <= iStack_110) &&
            auVar69._12_4_ <= iStack_10c) {
          pZVar17[-2].price = 0x40000000;
        }
        auVar63 = (auVar63 | auVar61) ^ _DAT_0015c8b0;
        iVar64 = auVar63._4_4_;
        if (iVar64 <= (int)local_118._4_4_ &&
            (iVar64 != local_118._4_4_ || auVar63._0_4_ <= (int)local_118._0_4_)) {
          pZVar17[-1].price = 0x40000000;
          pZVar17->price = 0x40000000;
        }
        uVar46 = uVar46 + 4;
        pZVar17 = pZVar17 + 4;
      } while (local_68 != (U32 *)uVar46);
      uVar57 = 0;
      uVar46 = (ulong)uVar59;
      do {
        UVar7 = pZVar2[uVar57].off;
        uVar6 = pZVar2[uVar57].len;
        rVar72 = ZSTD_updateRep(local_e0,UVar7,(uint)(UVar23 == 0));
        if ((uint)uVar46 <= uVar6) {
          uVar33 = 0x1f;
          if (UVar7 + 1 != 0) {
            for (; UVar7 + 1 >> uVar33 == 0; uVar33 = uVar33 - 1) {
            }
          }
          uVar28 = (uint)uVar46 * 0x100 - 0x200;
          do {
            UVar10 = (U32)uVar46;
            if ((ms->opt).priceType == zop_predef) {
              iVar64 = 0x1f;
              if (UVar10 - 2 != 0) {
                for (; UVar10 - 2 >> iVar64 == 0; iVar64 = iVar64 + -1) {
                }
              }
              iVar64 = (iVar64 + uVar33) * 0x100 + (uVar28 >> ((byte)iVar64 & 0x1f)) + 0x1000;
            }
            else {
              uVar44 = UVar10 - 3;
              uVar35 = (ms->opt).offCodeFreq[uVar33] + 1;
              iVar64 = 0x1f;
              if (uVar35 != 0) {
                for (; uVar35 >> iVar64 == 0; iVar64 = iVar64 + -1) {
                }
              }
              if (uVar44 < 0x80) {
                uVar44 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar44];
              }
              else {
                uVar24 = 0x1f;
                if (uVar44 != 0) {
                  for (; uVar44 >> uVar24 == 0; uVar24 = uVar24 - 1) {
                  }
                }
                uVar44 = (uVar24 ^ 0xffffffe0) + 0x44;
              }
              uVar24 = (ms->opt).matchLengthFreq[uVar44] + 1;
              iVar65 = 0x1f;
              if (uVar24 != 0) {
                for (; uVar24 >> iVar65 == 0; iVar65 = iVar65 + -1) {
                }
              }
              iVar64 = ((ML_bits[uVar44] + uVar33) - (iVar64 + iVar65)) * 0x100 +
                       (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                       ((uVar35 * 0x100 >> ((byte)iVar64 & 0x1f)) +
                       (uVar24 * 0x100 >> ((byte)iVar65 & 0x1f)))) + 0x33;
            }
            local_158[uVar46].mlen = UVar10;
            local_158[uVar46].off = UVar7;
            local_158[uVar46].litlen = UVar23;
            local_158[uVar46].price = iVar64 + UVar8 + iVar9;
            *(long *)local_158[uVar46].rep = rVar72.rep._0_8_;
            local_158[uVar46].rep[2] = rVar72.rep[2];
            uVar46 = (ulong)(UVar10 + 1);
            uVar28 = uVar28 + 0x100;
          } while (UVar10 + 1 <= uVar6);
        }
        uVar57 = uVar57 + 1;
      } while (uVar57 != uVar51);
      uVar6 = (int)uVar46 - 1;
      uVar46 = (ulong)uVar6;
      pZVar17 = local_158;
      if (uVar6 != 0) {
        local_60 = (uint *)((long)puVar30 + 0xc);
        local_80 = puVar30 + 1;
        local_e8 = (long)puVar30 + 0xb;
        uVar57 = 1;
LAB_001206c7:
        uVar53 = uVar57;
        poVar37 = local_f0;
        iVar9 = (int)uVar53;
        pZVar54 = pZVar17 + (iVar9 - 1U);
        UVar23 = 1;
        if (pZVar17[iVar9 - 1U].mlen == 0) {
          UVar23 = pZVar54->litlen + 1;
        }
        puVar38 = (ulong *)((long)puVar30 + uVar53);
        iVar64 = pZVar54->price;
        UVar8 = ZSTD_rawLiteralsCost((BYTE *)((long)puVar38 + -1),1,local_f0,2);
        UVar7 = ZSTD_litLengthPrice(UVar23,poVar37,2);
        UVar10 = ZSTD_litLengthPrice(UVar23 - 1,poVar37,2);
        iVar65 = (UVar7 + UVar8 + iVar64) - UVar10;
        pZVar1 = local_158 + uVar53;
        iVar64 = local_158[uVar53].price;
        if (iVar65 <= local_158[uVar53].price) {
          pZVar1->off = 0;
          pZVar1->mlen = 0;
          pZVar1->litlen = UVar23;
          pZVar1->price = iVar65;
          *(undefined8 *)pZVar1->rep = *(undefined8 *)pZVar54->rep;
          pZVar1->rep[2] = pZVar54->rep[2];
          iVar64 = iVar65;
        }
        pZVar17 = local_158;
        if (local_a0 < puVar38) goto LAB_0012189d;
        if (iVar9 != (int)uVar46) {
          UVar8 = pZVar1->mlen;
          UVar23 = 0;
          auVar4._12_4_ = 0;
          auVar4._0_12_ = stack0xffffffffffffff3c;
          _local_c8 = auVar4 << 0x20;
          if (UVar8 == 0) {
            UVar23 = pZVar1->litlen;
          }
          UVar7 = ZSTD_litLengthPrice(0,local_f0,2);
          pBVar32 = (ms->window).base;
          uVar6 = ms->nextToUpdate;
          uVar57 = (ulong)uVar6;
          pZVar17 = local_158;
          if (puVar38 < pBVar32 + uVar57) goto LAB_0012189d;
          local_a8 = CONCAT71(local_a8._1_7_,UVar8 != 0);
          UVar10 = (ms->cParams).minMatch;
          iVar65 = (int)puVar38;
          uVar33 = iVar65 - (int)pBVar32;
          local_d8 = (U32 *)(uVar53 * 0x1c);
          puVar31 = local_130;
          puVar29 = local_80;
          while (local_130 = puVar31, local_80 = puVar29, uVar6 < uVar33) {
            UVar11 = ZSTD_insertBt1(ms,pBVar32 + uVar57,(BYTE *)puVar58,UVar10,0);
            uVar6 = (int)uVar57 + UVar11;
            uVar57 = (ulong)uVar6;
            puVar31 = local_130;
            puVar29 = local_80;
          }
          ms->nextToUpdate = uVar33;
          local_100._4_4_ = (undefined4)((ulong)local_100 >> 0x20);
          local_150._4_4_ = (undefined4)((ulong)local_150 >> 0x20);
          if (UVar10 - 6 < 2) {
            uVar57 = (ulong)(UVar8 != 0);
            uVar6 = (ms->cParams).targetLength;
            if (0xffe < uVar6) {
              uVar6 = 0xfff;
            }
            pBVar32 = (ms->window).base;
            uVar35 = iVar65 - (int)pBVar32;
            local_148 = (BYTE *)(ulong)uVar35;
            local_128 = ms->hashTable;
            uVar48 = 0;
            local_b0 = (ulong *)(*puVar38 * -0x30e4432340650000 >>
                                (-(char)(ms->cParams).hashLog & 0x3fU));
            local_120 = ms->chainTable;
            uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar28 = uVar35 - uVar33;
            if (uVar35 < uVar33) {
              uVar28 = 0;
            }
            UVar10 = (ms->window).lowLimit;
            uVar24 = UVar10 + (UVar10 == 0);
            local_100 = (U32 *)CONCAT44(local_100._4_4_,uVar33);
            uVar41 = (ulong)((uVar33 & uVar35) * 2);
            local_1c8 = local_120 + uVar41;
            UVar10 = (ms->window).dictLimit;
            uVar44 = local_128[(long)local_b0];
            iVar65 = uVar35 + 9;
            uVar51 = (ms->cParams).searchLog;
            local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar51);
            uVar22 = uVar57 + 3;
            puVar21 = (ulong *)((long)puVar38 + 4);
            uVar50 = uVar15;
            do {
              if (uVar57 == 3) {
                uVar52 = pZVar1->rep[0] - 1;
              }
              else {
                uVar52 = pZVar1->rep[uVar57];
              }
              uVar49 = 0;
              if ((uVar52 - 1 < uVar35 - UVar10) &&
                 ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)uVar52))) {
                lVar14 = -(ulong)uVar52;
                puVar56 = (ulong *)((long)puVar21 + lVar14);
                puVar40 = puVar21;
                if (puVar21 < puVar12) {
                  if (*puVar56 == *puVar21) {
                    lVar14 = lVar14 + uVar53;
                    lVar55 = 0;
                    do {
                      puVar40 = (ulong *)((long)local_60 + lVar55 + uVar53);
                      if (puVar12 <= puVar40) {
                        puVar56 = (ulong *)((long)local_60 + lVar55 + lVar14);
                        goto LAB_00120e04;
                      }
                      uVar49 = *(ulong *)((long)local_60 + lVar55 + lVar14);
                      lVar55 = lVar55 + 8;
                    } while (uVar49 == *puVar40);
                    uVar49 = *puVar40 ^ uVar49;
                    uVar43 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar52 = ((uint)(uVar43 >> 3) & 0x1fffffff) + (int)lVar55;
                  }
                  else {
                    uVar43 = *puVar21 ^ *puVar56;
                    uVar49 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                      }
                    }
                    uVar52 = (uint)(uVar49 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_00120e04:
                  if ((puVar40 < puVar13) && ((uint)*puVar56 == (uint)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 4);
                    puVar56 = (ulong *)((long)puVar56 + 4);
                  }
                  if ((puVar40 < puVar20) && ((short)*puVar56 == (short)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 2);
                    puVar56 = (ulong *)((long)puVar56 + 2);
                  }
                  if (puVar40 < puVar58) {
                    puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar56 == (BYTE)*puVar40));
                  }
                  uVar52 = (int)puVar40 - (int)puVar21;
                }
                uVar49 = (ulong)(uVar52 + 4);
              }
              if (uVar50 < uVar49) {
                pZVar2[uVar48].off = (int)uVar57 - (uint)(UVar8 != 0);
                pZVar2[uVar48].len = (uint)uVar49;
                uVar52 = (int)uVar48 + 1;
                uVar48 = (ulong)uVar52;
                if ((uVar6 < (uint)uVar49) ||
                   (uVar50 = uVar49, (ulong *)((long)puVar38 + uVar49) == puVar58))
                goto LAB_00121658;
              }
              uVar52 = (uint)uVar48;
              uVar57 = uVar57 + 1;
            } while (uVar57 < uVar22);
            local_128[(long)local_b0] = uVar35;
            local_1c0 = local_120 + uVar41 + 1;
            if (uVar24 <= uVar44) {
              uVar6 = ~(-1 << ((byte)uVar51 & 0x1f));
              local_148 = (BYTE *)(ulong)(uVar35 + 2);
              local_128 = (uint *)(pBVar32 + 8);
              local_188 = 0;
              uVar57 = 0;
              iVar66 = iVar65;
              do {
                uVar41 = (ulong)uVar44;
                uVar22 = uVar57;
                if (local_188 < uVar57) {
                  uVar22 = local_188;
                }
                puVar56 = (ulong *)((long)puVar38 + uVar22);
                puVar31 = (ulong *)(pBVar32 + uVar22 + uVar41);
                puVar21 = puVar56;
                if (puVar56 < puVar12) {
                  if (*puVar31 == *puVar56) {
                    lVar14 = 0;
                    do {
                      puVar21 = (ulong *)((long)puVar29 + lVar14 + uVar22 + uVar53);
                      if (puVar12 <= puVar21) {
                        puVar31 = (ulong *)((long)local_128 + uVar41 + uVar22 + lVar14);
                        goto LAB_00120fe5;
                      }
                      uVar49 = *(ulong *)((long)local_128 + lVar14 + uVar41 + uVar22);
                      lVar14 = lVar14 + 8;
                    } while (uVar49 == *puVar21);
                    uVar49 = *puVar21 ^ uVar49;
                    uVar43 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar49 = (uVar43 >> 3 & 0x1fffffff) + lVar14;
                  }
                  else {
                    uVar43 = *puVar56 ^ *puVar31;
                    uVar49 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                      }
                    }
                    uVar49 = uVar49 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00120fe5:
                  if ((puVar21 < puVar13) && ((uint)*puVar31 == (uint)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar21 < puVar20) && ((short)*puVar31 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar21 < puVar58) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar21));
                  }
                  uVar49 = (long)puVar21 - (long)puVar56;
                }
                uVar49 = uVar49 + uVar22;
                iVar65 = iVar66;
                if (uVar50 < uVar49) {
                  iVar65 = uVar44 + (U32)uVar49;
                  if (uVar49 <= iVar66 - uVar44) {
                    iVar65 = iVar66;
                  }
                  pZVar2[uVar48].off = (uVar35 + 2) - uVar44;
                  pZVar2[uVar48].len = (U32)uVar49;
                  uVar52 = (int)uVar48 + 1;
                  uVar48 = (ulong)uVar52;
                  if ((0x1000 < uVar49) ||
                     (uVar50 = uVar49, (ulong *)((long)puVar38 + uVar49) == puVar58)) break;
                }
                uVar52 = (uint)uVar48;
                puVar27 = local_120 + (uVar44 & uVar33) * 2;
                if (pBVar32[uVar49 + uVar41] < *(byte *)((long)puVar38 + uVar49)) {
                  *local_1c8 = uVar44;
                  if (uVar44 <= uVar28) goto LAB_00121d49;
                  local_1c8 = puVar27 + 1;
                  puVar27 = local_1c0;
                  puVar26 = local_1c8;
                  local_188 = uVar49;
                }
                else {
                  *local_1c0 = uVar44;
                  puVar26 = puVar27;
                  uVar57 = uVar49;
                  if (uVar44 <= uVar28) goto LAB_00121d3c;
                }
                bVar60 = uVar6 == 0;
                uVar6 = uVar6 - 1;
                local_1c0 = puVar27;
                if ((bVar60) || (uVar44 = *puVar26, iVar66 = iVar65, uVar44 < uVar24)) break;
              } while( true );
            }
            goto LAB_001213b3;
          }
          if (UVar10 == 5) {
            uVar57 = (ulong)(UVar8 != 0);
            uVar6 = (ms->cParams).targetLength;
            if (0xffe < uVar6) {
              uVar6 = 0xfff;
            }
            pBVar32 = (ms->window).base;
            uVar35 = iVar65 - (int)pBVar32;
            local_148 = (BYTE *)(ulong)uVar35;
            local_128 = ms->hashTable;
            uVar48 = 0;
            local_b0 = (ulong *)(*puVar38 * -0x30e4432345000000 >>
                                (-(char)(ms->cParams).hashLog & 0x3fU));
            local_120 = ms->chainTable;
            uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar28 = uVar35 - uVar33;
            if (uVar35 < uVar33) {
              uVar28 = 0;
            }
            UVar10 = (ms->window).lowLimit;
            uVar24 = UVar10 + (UVar10 == 0);
            local_100 = (U32 *)CONCAT44(local_100._4_4_,uVar33);
            uVar41 = (ulong)((uVar33 & uVar35) * 2);
            local_1c8 = local_120 + uVar41;
            UVar10 = (ms->window).dictLimit;
            uVar44 = local_128[(long)local_b0];
            iVar65 = uVar35 + 9;
            uVar51 = (ms->cParams).searchLog;
            local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar51);
            uVar22 = uVar57 + 3;
            puVar21 = (ulong *)((long)puVar38 + 4);
            uVar50 = uVar15;
            do {
              if (uVar57 == 3) {
                uVar52 = pZVar1->rep[0] - 1;
              }
              else {
                uVar52 = pZVar1->rep[uVar57];
              }
              uVar49 = 0;
              if ((uVar52 - 1 < uVar35 - UVar10) &&
                 ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)uVar52))) {
                lVar14 = -(ulong)uVar52;
                puVar56 = (ulong *)((long)puVar21 + lVar14);
                puVar40 = puVar21;
                if (puVar21 < puVar12) {
                  if (*puVar56 == *puVar21) {
                    lVar14 = lVar14 + uVar53;
                    lVar55 = 0;
                    do {
                      puVar40 = (ulong *)((long)local_60 + lVar55 + uVar53);
                      if (puVar12 <= puVar40) {
                        puVar56 = (ulong *)((long)local_60 + lVar55 + lVar14);
                        goto LAB_001212d4;
                      }
                      uVar49 = *(ulong *)((long)local_60 + lVar55 + lVar14);
                      lVar55 = lVar55 + 8;
                    } while (uVar49 == *puVar40);
                    uVar49 = *puVar40 ^ uVar49;
                    uVar43 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar52 = ((uint)(uVar43 >> 3) & 0x1fffffff) + (int)lVar55;
                  }
                  else {
                    uVar43 = *puVar21 ^ *puVar56;
                    uVar49 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                      }
                    }
                    uVar52 = (uint)(uVar49 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_001212d4:
                  if ((puVar40 < puVar13) && ((uint)*puVar56 == (uint)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 4);
                    puVar56 = (ulong *)((long)puVar56 + 4);
                  }
                  if ((puVar40 < puVar20) && ((short)*puVar56 == (short)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 2);
                    puVar56 = (ulong *)((long)puVar56 + 2);
                  }
                  if (puVar40 < puVar58) {
                    puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar56 == (BYTE)*puVar40));
                  }
                  uVar52 = (int)puVar40 - (int)puVar21;
                }
                uVar49 = (ulong)(uVar52 + 4);
              }
              if (uVar50 < uVar49) {
                pZVar2[uVar48].off = (int)uVar57 - (uint)(UVar8 != 0);
                pZVar2[uVar48].len = (uint)uVar49;
                uVar52 = (int)uVar48 + 1;
                uVar48 = (ulong)uVar52;
                if ((uVar6 < (uint)uVar49) ||
                   (uVar50 = uVar49, (ulong *)((long)puVar38 + uVar49) == puVar58))
                goto LAB_00121658;
              }
              uVar52 = (uint)uVar48;
              uVar57 = uVar57 + 1;
            } while (uVar57 < uVar22);
            local_128[(long)local_b0] = uVar35;
            local_1c0 = local_120 + uVar41 + 1;
            if (uVar24 <= uVar44) {
              uVar6 = ~(-1 << ((byte)uVar51 & 0x1f));
              local_148 = (BYTE *)(ulong)(uVar35 + 2);
              local_128 = (uint *)(pBVar32 + 8);
              local_188 = 0;
              uVar57 = 0;
              iVar66 = iVar65;
              do {
                uVar41 = (ulong)uVar44;
                uVar22 = uVar57;
                if (local_188 < uVar57) {
                  uVar22 = local_188;
                }
                puVar56 = (ulong *)((long)puVar38 + uVar22);
                puVar31 = (ulong *)(pBVar32 + uVar22 + uVar41);
                puVar21 = puVar56;
                if (puVar56 < puVar12) {
                  if (*puVar31 == *puVar56) {
                    lVar14 = 0;
                    do {
                      puVar21 = (ulong *)((long)puVar29 + lVar14 + uVar22 + uVar53);
                      if (puVar12 <= puVar21) {
                        puVar31 = (ulong *)((long)local_128 + uVar41 + uVar22 + lVar14);
                        goto LAB_001219a6;
                      }
                      uVar49 = *(ulong *)((long)local_128 + lVar14 + uVar41 + uVar22);
                      lVar14 = lVar14 + 8;
                    } while (uVar49 == *puVar21);
                    uVar49 = *puVar21 ^ uVar49;
                    uVar43 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar49 = (uVar43 >> 3 & 0x1fffffff) + lVar14;
                  }
                  else {
                    uVar43 = *puVar56 ^ *puVar31;
                    uVar49 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                      }
                    }
                    uVar49 = uVar49 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001219a6:
                  if ((puVar21 < puVar13) && ((uint)*puVar31 == (uint)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar21 < puVar20) && ((short)*puVar31 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar21 < puVar58) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar21));
                  }
                  uVar49 = (long)puVar21 - (long)puVar56;
                }
                uVar49 = uVar49 + uVar22;
                iVar65 = iVar66;
                if (uVar50 < uVar49) {
                  iVar65 = uVar44 + (U32)uVar49;
                  if (uVar49 <= iVar66 - uVar44) {
                    iVar65 = iVar66;
                  }
                  pZVar2[uVar48].off = (uVar35 + 2) - uVar44;
                  pZVar2[uVar48].len = (U32)uVar49;
                  uVar52 = (int)uVar48 + 1;
                  uVar48 = (ulong)uVar52;
                  if ((0x1000 < uVar49) ||
                     (uVar50 = uVar49, (ulong *)((long)puVar38 + uVar49) == puVar58)) break;
                }
                uVar52 = (uint)uVar48;
                puVar27 = local_120 + (uVar44 & uVar33) * 2;
                if (pBVar32[uVar49 + uVar41] < *(byte *)((long)puVar38 + uVar49)) {
                  *local_1c8 = uVar44;
                  if (uVar44 <= uVar28) goto LAB_00121d49;
                  local_1c8 = puVar27 + 1;
                  puVar27 = local_1c0;
                  puVar26 = local_1c8;
                  local_188 = uVar49;
                }
                else {
                  *local_1c0 = uVar44;
                  puVar26 = puVar27;
                  uVar57 = uVar49;
                  if (uVar44 <= uVar28) goto LAB_00121d3c;
                }
                bVar60 = uVar6 == 0;
                uVar6 = uVar6 - 1;
                local_1c0 = puVar27;
                if ((bVar60) || (uVar44 = *puVar26, iVar66 = iVar65, uVar44 < uVar24)) break;
              } while( true );
            }
            goto LAB_001213b3;
          }
          if (UVar10 != 3) {
            uVar57 = (ulong)(UVar8 != 0);
            uVar6 = (ms->cParams).targetLength;
            if (0xffe < uVar6) {
              uVar6 = 0xfff;
            }
            pBVar32 = (ms->window).base;
            uVar35 = iVar65 - (int)pBVar32;
            local_148 = (BYTE *)(ulong)uVar35;
            local_128 = ms->hashTable;
            uVar48 = 0;
            local_b0 = (ulong *)(ulong)((uint)*puVar38 * -0x61c8864f >>
                                       (-(char)(ms->cParams).hashLog & 0x1fU));
            local_120 = ms->chainTable;
            uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar28 = uVar35 - uVar33;
            if (uVar35 < uVar33) {
              uVar28 = 0;
            }
            UVar10 = (ms->window).lowLimit;
            uVar24 = UVar10 + (UVar10 == 0);
            local_100 = (U32 *)CONCAT44(local_100._4_4_,uVar33);
            uVar22 = (ulong)((uVar33 & uVar35) * 2);
            local_1c8 = local_120 + uVar22;
            local_1c0 = local_120 + uVar22 + 1;
            UVar10 = (ms->window).dictLimit;
            uVar44 = local_128[(long)local_b0];
            iVar65 = uVar35 + 9;
            uVar51 = (ms->cParams).searchLog;
            local_150 = (U32 *)CONCAT44(local_150._4_4_,uVar51);
            uVar22 = uVar57 + 3;
            puVar21 = (ulong *)((long)puVar38 + 4);
            uVar50 = uVar15;
            do {
              if (uVar57 == 3) {
                uVar52 = pZVar1->rep[0] - 1;
              }
              else {
                uVar52 = pZVar1->rep[uVar57];
              }
              uVar41 = 0;
              if ((uVar52 - 1 < uVar35 - UVar10) &&
                 ((uint)*puVar38 == *(uint *)((long)puVar38 - (ulong)uVar52))) {
                lVar14 = -(ulong)uVar52;
                puVar56 = (ulong *)((long)puVar21 + lVar14);
                puVar40 = puVar21;
                if (puVar21 < puVar12) {
                  if (*puVar56 == *puVar21) {
                    lVar14 = lVar14 + uVar53;
                    lVar55 = 0;
                    do {
                      puVar40 = (ulong *)((long)local_60 + lVar55 + uVar53);
                      if (puVar12 <= puVar40) {
                        puVar56 = (ulong *)((long)local_60 + lVar55 + lVar14);
                        goto LAB_0012155e;
                      }
                      uVar41 = *(ulong *)((long)local_60 + lVar55 + lVar14);
                      lVar55 = lVar55 + 8;
                    } while (uVar41 == *puVar40);
                    uVar41 = *puVar40 ^ uVar41;
                    uVar49 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                      }
                    }
                    uVar52 = ((uint)(uVar49 >> 3) & 0x1fffffff) + (int)lVar55;
                  }
                  else {
                    uVar49 = *puVar21 ^ *puVar56;
                    uVar41 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    uVar52 = (uint)(uVar41 >> 3) & 0x1fffffff;
                  }
                }
                else {
LAB_0012155e:
                  if ((puVar40 < puVar13) && ((uint)*puVar56 == (uint)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 4);
                    puVar56 = (ulong *)((long)puVar56 + 4);
                  }
                  if ((puVar40 < puVar20) && ((short)*puVar56 == (short)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 2);
                    puVar56 = (ulong *)((long)puVar56 + 2);
                  }
                  if (puVar40 < puVar58) {
                    puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar56 == (BYTE)*puVar40));
                  }
                  uVar52 = (int)puVar40 - (int)puVar21;
                }
                uVar41 = (ulong)(uVar52 + 4);
              }
              if (uVar50 < uVar41) {
                pZVar2[uVar48].off = (int)uVar57 - (uint)(UVar8 != 0);
                pZVar2[uVar48].len = (uint)uVar41;
                uVar52 = (int)uVar48 + 1;
                uVar48 = (ulong)uVar52;
                if ((uVar6 < (uint)uVar41) ||
                   (uVar50 = uVar41, (ulong *)((long)puVar38 + uVar41) == puVar58))
                goto LAB_00121658;
              }
              uVar52 = (uint)uVar48;
              uVar57 = uVar57 + 1;
            } while (uVar57 < uVar22);
            local_128[(long)local_b0] = uVar35;
            if (uVar24 <= uVar44) {
              uVar6 = ~(-1 << ((byte)uVar51 & 0x1f));
              local_148 = (BYTE *)(ulong)(uVar35 + 2);
              local_128 = (uint *)(pBVar32 + 8);
              local_188 = 0;
              uVar57 = 0;
              iVar66 = iVar65;
              do {
                uVar41 = (ulong)uVar44;
                uVar22 = uVar57;
                if (local_188 < uVar57) {
                  uVar22 = local_188;
                }
                puVar56 = (ulong *)((long)puVar38 + uVar22);
                puVar31 = (ulong *)(pBVar32 + uVar22 + uVar41);
                puVar21 = puVar56;
                if (puVar56 < puVar12) {
                  if (*puVar31 == *puVar56) {
                    lVar14 = 0;
                    do {
                      puVar21 = (ulong *)((long)puVar29 + lVar14 + uVar22 + uVar53);
                      if (puVar12 <= puVar21) {
                        puVar31 = (ulong *)((long)local_128 + uVar41 + uVar22 + lVar14);
                        goto LAB_00121be8;
                      }
                      uVar49 = *(ulong *)((long)local_128 + lVar14 + uVar41 + uVar22);
                      lVar14 = lVar14 + 8;
                    } while (uVar49 == *puVar21);
                    uVar49 = *puVar21 ^ uVar49;
                    uVar43 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar49 = (uVar43 >> 3 & 0x1fffffff) + lVar14;
                  }
                  else {
                    uVar43 = *puVar56 ^ *puVar31;
                    uVar49 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                      }
                    }
                    uVar49 = uVar49 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00121be8:
                  if ((puVar21 < puVar13) && ((uint)*puVar31 == (uint)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar21 < puVar20) && ((short)*puVar31 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar21 < puVar58) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar21));
                  }
                  uVar49 = (long)puVar21 - (long)puVar56;
                }
                uVar49 = uVar49 + uVar22;
                iVar65 = iVar66;
                if (uVar50 < uVar49) {
                  iVar65 = uVar44 + (U32)uVar49;
                  if (uVar49 <= iVar66 - uVar44) {
                    iVar65 = iVar66;
                  }
                  pZVar2[uVar48].off = (uVar35 + 2) - uVar44;
                  pZVar2[uVar48].len = (U32)uVar49;
                  uVar52 = (int)uVar48 + 1;
                  uVar48 = (ulong)uVar52;
                  if ((0x1000 < uVar49) ||
                     (uVar50 = uVar49, (ulong *)((long)puVar38 + uVar49) == puVar58)) break;
                }
                uVar52 = (uint)uVar48;
                puVar27 = local_120 + (uVar44 & uVar33) * 2;
                if (pBVar32[uVar49 + uVar41] < *(byte *)((long)puVar38 + uVar49)) {
                  *local_1c8 = uVar44;
                  if (uVar44 <= uVar28) {
                    local_1c8 = (uint *)&local_140;
                    break;
                  }
                  puVar27 = puVar27 + 1;
                  local_1c8 = puVar27;
                  local_188 = uVar49;
                }
                else {
                  *local_1c0 = uVar44;
                  local_1c0 = puVar27;
                  uVar57 = uVar49;
                  if (uVar44 <= uVar28) {
                    local_1c0 = (uint *)&local_140;
                    break;
                  }
                }
                bVar60 = uVar6 == 0;
                uVar6 = uVar6 - 1;
                if ((bVar60) || (uVar44 = *puVar27, iVar66 = iVar65, uVar44 < uVar24)) break;
              } while( true );
            }
            *local_1c0 = 0;
            *local_1c8 = 0;
            goto LAB_0012163c;
          }
          uVar57 = (ulong)(UVar8 != 0);
          uVar6 = (ms->cParams).targetLength;
          if (0xffe < uVar6) {
            uVar6 = 0xfff;
          }
          pBVar32 = (ms->window).base;
          uVar28 = iVar65 - (int)pBVar32;
          local_128 = (uint *)(ulong)uVar28;
          local_b0 = (ulong *)ms->hashTable;
          uVar48 = 0;
          local_150 = (U32 *)(ulong)((uint)*puVar38 * -0x61c8864f >>
                                    (-(char)(ms->cParams).hashLog & 0x1fU));
          local_100 = ms->chainTable;
          uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar65 = uVar28 - uVar33;
          if (uVar28 < uVar33) {
            iVar65 = 0;
          }
          local_120._4_4_ = (undefined4)((ulong)local_120 >> 0x20);
          local_120 = (U32 *)CONCAT44(local_120._4_4_,iVar65);
          UVar10 = (ms->window).lowLimit;
          uVar35 = UVar10 + (UVar10 == 0);
          local_148._4_4_ = (undefined4)((ulong)local_148 >> 0x20);
          local_148 = (BYTE *)CONCAT44(local_148._4_4_,uVar33);
          uVar22 = (ulong)((uVar33 & uVar28) * 2);
          local_1a8 = local_100 + uVar22;
          local_1c8 = local_100 + uVar22 + 1;
          UVar10 = (ms->window).dictLimit;
          uVar33 = *(uint *)((long)local_b0 + (long)local_150 * 4);
          iVar65 = uVar28 + 9;
          uVar22 = (ulong)local_70 >> 0x20;
          local_70 = CONCAT44((int)uVar22,(ms->cParams).searchLog);
          uVar22 = uVar57 + 3;
          puVar21 = (ulong *)((long)puVar38 + 3);
          uVar50 = uVar15;
          do {
            if (uVar57 == 3) {
              UVar11 = pZVar1->rep[0] - 1;
            }
            else {
              UVar11 = pZVar1->rep[uVar57];
            }
            uVar51 = 0;
            if ((UVar11 - 1 < uVar28 - UVar10) &&
               (uVar51 = 0,
               ((*(uint *)((long)puVar38 - (ulong)UVar11) ^ (uint)*puVar38) & 0xffffff) == 0)) {
              lVar14 = -(ulong)UVar11;
              puVar56 = (ulong *)((long)puVar21 + lVar14);
              puVar40 = puVar21;
              if (puVar21 < puVar12) {
                if (*puVar56 == *puVar21) {
                  lVar14 = lVar14 + uVar53 + local_e8;
                  lVar55 = 0;
                  do {
                    puVar40 = (ulong *)(uVar53 + local_e8 + lVar55);
                    if (puVar12 <= puVar40) {
                      puVar56 = (ulong *)(lVar14 + lVar55);
                      goto LAB_00120abc;
                    }
                    uVar41 = *(ulong *)(lVar14 + lVar55);
                    lVar55 = lVar55 + 8;
                  } while (uVar41 == *puVar40);
                  uVar41 = *puVar40 ^ uVar41;
                  uVar49 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                    }
                  }
                  uVar51 = ((uint)(uVar49 >> 3) & 0x1fffffff) + (int)lVar55;
                }
                else {
                  uVar49 = *puVar21 ^ *puVar56;
                  uVar41 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                    }
                  }
                  uVar51 = (uint)(uVar41 >> 3) & 0x1fffffff;
                }
              }
              else {
LAB_00120abc:
                if ((puVar40 < puVar13) && ((uint)*puVar56 == (uint)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 4);
                  puVar56 = (ulong *)((long)puVar56 + 4);
                }
                if ((puVar40 < puVar20) && ((short)*puVar56 == (short)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 2);
                  puVar56 = (ulong *)((long)puVar56 + 2);
                }
                if (puVar40 < puVar58) {
                  puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar56 == (BYTE)*puVar40));
                }
                uVar51 = (int)puVar40 - (int)puVar21;
              }
              uVar51 = uVar51 + 3;
            }
            uVar41 = (ulong)uVar51;
            if (uVar50 < uVar41) {
              pZVar2[uVar48].off = (int)uVar57 - (uint)(UVar8 != 0);
              pZVar2[uVar48].len = uVar51;
              uVar52 = (int)uVar48 + 1;
              uVar48 = (ulong)uVar52;
              if ((uVar6 < uVar51) ||
                 (uVar50 = uVar41, (ulong *)((long)puVar38 + uVar41) == puVar58)) goto LAB_00121658;
            }
            uVar57 = uVar57 + 1;
          } while (uVar57 < uVar22);
          if ((uVar50 < 3) &&
             (UVar8 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar38), uVar35 <= UVar8)) {
            uVar28 = (uint)local_128;
            if (0x3ffff < uVar28 - UVar8) goto LAB_00121d7f;
            uVar57 = (ulong)UVar8;
            puVar31 = (ulong *)(pBVar32 + uVar57);
            puVar21 = puVar38;
            if (puVar38 < puVar12) {
              if (*puVar31 == *puVar38) {
                lVar14 = 0;
                do {
                  puVar21 = (ulong *)((long)puVar29 + lVar14 + uVar53);
                  if (puVar12 <= puVar21) {
                    puVar31 = (ulong *)(pBVar32 + lVar14 + uVar57 + 8);
                    goto LAB_0012209a;
                  }
                  lVar55 = lVar14 + uVar57 + 8;
                  lVar14 = lVar14 + 8;
                } while (*(ulong *)(pBVar32 + lVar55) == *puVar21);
                uVar22 = *puVar21 ^ *(ulong *)(pBVar32 + lVar55);
                uVar57 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                  }
                }
                uVar57 = (uVar57 >> 3 & 0x1fffffff) + lVar14;
              }
              else {
                uVar22 = *puVar38 ^ *puVar31;
                uVar57 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                  }
                }
                uVar57 = uVar57 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0012209a:
              if ((puVar21 < puVar13) && ((uint)*puVar31 == (uint)*puVar21)) {
                puVar21 = (ulong *)((long)puVar21 + 4);
                puVar31 = (ulong *)((long)puVar31 + 4);
              }
              if ((puVar21 < puVar20) && ((short)*puVar31 == (short)*puVar21)) {
                puVar21 = (ulong *)((long)puVar21 + 2);
                puVar31 = (ulong *)((long)puVar31 + 2);
              }
              if (puVar21 < puVar58) {
                puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar21));
              }
              uVar57 = (long)puVar21 - (long)puVar38;
            }
            if (uVar57 < 3) goto LAB_00121d7f;
            pZVar2->off = (uVar28 - UVar8) + 2;
            pZVar2->len = (U32)uVar57;
            if ((uVar57 <= uVar6) &&
               (uVar48 = 1, uVar50 = uVar57, (ulong *)((long)puVar38 + uVar57) != puVar58))
            goto LAB_00121d7f;
            UVar8 = uVar28 + 1;
            uVar52 = 1;
            puVar31 = local_130;
          }
          else {
            uVar28 = (uint)local_128;
LAB_00121d7f:
            puVar31 = local_130;
            uVar52 = (uint)uVar48;
            *(uint *)((long)local_b0 + (long)local_150 * 4) = uVar28;
            if (uVar35 <= uVar33) {
              uVar6 = ~(-1 << ((byte)local_70 & 0x1f));
              local_128 = (uint *)(ulong)(uVar28 + 2);
              uVar22 = 0;
              uVar57 = 0;
              do {
                uVar41 = uVar57;
                if (uVar22 < uVar57) {
                  uVar41 = uVar22;
                }
                uVar49 = (ulong)uVar33;
                puVar21 = (ulong *)((long)puVar38 + uVar41);
                puVar56 = (ulong *)(pBVar32 + uVar41 + uVar49);
                puVar40 = puVar21;
                if (puVar21 < puVar12) {
                  if (*puVar56 == *puVar21) {
                    lVar14 = 0;
                    do {
                      puVar40 = (ulong *)((long)puVar29 + lVar14 + uVar41 + uVar53);
                      if (puVar12 <= puVar40) {
                        puVar56 = (ulong *)(pBVar32 + uVar49 + uVar41 + lVar14 + 8);
                        goto LAB_00121e91;
                      }
                      lVar55 = lVar14 + uVar49 + uVar41 + 8;
                      lVar14 = lVar14 + 8;
                    } while (*(ulong *)(pBVar32 + lVar55) == *puVar40);
                    uVar42 = *puVar40 ^ *(ulong *)(pBVar32 + lVar55);
                    uVar43 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar43 = (uVar43 >> 3 & 0x1fffffff) + lVar14;
                  }
                  else {
                    uVar42 = *puVar21 ^ *puVar56;
                    uVar43 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar43 = uVar43 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00121e91:
                  if ((puVar40 < puVar13) && ((uint)*puVar56 == (uint)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 4);
                    puVar56 = (ulong *)((long)puVar56 + 4);
                  }
                  if ((puVar40 < puVar20) && ((short)*puVar56 == (short)*puVar40)) {
                    puVar40 = (ulong *)((long)puVar40 + 2);
                    puVar56 = (ulong *)((long)puVar56 + 2);
                  }
                  if (puVar40 < puVar58) {
                    puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar56 == (BYTE)*puVar40));
                  }
                  uVar43 = (long)puVar40 - (long)puVar21;
                }
                uVar43 = uVar43 + uVar41;
                if (uVar50 < uVar43) {
                  iVar66 = uVar33 + (U32)uVar43;
                  if (uVar43 <= iVar65 - uVar33) {
                    iVar66 = iVar65;
                  }
                  iVar65 = iVar66;
                  pZVar2[uVar48].off = (uVar28 + 2) - uVar33;
                  pZVar2[uVar48].len = (U32)uVar43;
                  uVar52 = (int)uVar48 + 1;
                  uVar48 = (ulong)uVar52;
                  if ((0x1000 < uVar43) ||
                     (uVar50 = uVar43, (ulong *)((long)puVar38 + uVar43) == puVar58)) break;
                }
                uVar52 = (uint)uVar48;
                puVar27 = local_100 + (uVar33 & (uint)local_148) * 2;
                if (pBVar32[uVar43 + uVar49] < *(byte *)((long)puVar38 + uVar43)) {
                  *local_1a8 = uVar33;
                  if (uVar33 <= (uint)local_120) {
                    local_1a8 = (uint *)&local_140;
                    break;
                  }
                  puVar27 = puVar27 + 1;
                  uVar22 = uVar43;
                  local_1a8 = puVar27;
                }
                else {
                  *local_1c8 = uVar33;
                  uVar57 = uVar43;
                  local_1c8 = puVar27;
                  if (uVar33 <= (uint)local_120) {
                    local_1c8 = (uint *)&local_140;
                    break;
                  }
                }
                bVar60 = uVar6 == 0;
                uVar6 = uVar6 - 1;
                if ((bVar60) || (uVar33 = *puVar27, uVar33 < uVar35)) break;
              } while( true );
            }
            *local_1c8 = 0;
            *local_1a8 = 0;
            UVar8 = iVar65 - 8;
          }
          ms->nextToUpdate = UVar8;
          goto LAB_00121658;
        }
        goto LAB_001227e9;
      }
      uVar53 = 0;
LAB_001227e9:
      uVar46 = uVar53 & 0xffffffff;
      local_f8._0_4_ = pZVar17[uVar46].price;
      UVar7 = pZVar17[uVar46].off;
      uVar6 = pZVar17[uVar46].mlen;
      UVar23 = pZVar17[uVar46].litlen;
      local_88 = pZVar17[uVar46].rep[2];
      local_90 = *(undefined8 *)pZVar17[uVar46].rep;
      uVar33 = (uint)uVar53 - (UVar23 + uVar6);
      puVar31 = local_130;
      pUVar18 = local_e0;
      if ((uint)uVar53 < UVar23 + uVar6) {
        uVar33 = 0;
      }
    }
    uVar28 = uVar33 + 1;
    pZVar17[uVar28].price = (int)local_f8;
    pZVar17[uVar28].off = UVar7;
    pZVar17[uVar28].mlen = uVar6;
    pZVar17[uVar28].litlen = UVar23;
    *(undefined8 *)pZVar17[uVar28].rep = local_90;
    pZVar17[uVar28].rep[2] = local_88;
    uVar46 = (ulong)uVar33;
    poVar37 = local_f0;
    if (uVar33 == 0) {
      uVar6 = 1;
      goto LAB_0012290b;
    }
    do {
      uVar6 = uVar33;
      uVar35 = (uint)uVar46;
      uVar51 = pZVar17[uVar46].litlen + pZVar17[uVar46].mlen;
      pZVar54 = pZVar17 + uVar46;
      iVar9 = pZVar54->price;
      UVar8 = pZVar54->off;
      UVar7 = pZVar54->mlen;
      UVar10 = pZVar54->litlen;
      pZVar54 = pZVar17 + uVar46;
      UVar23 = pZVar54->rep[0];
      uVar3 = *(undefined8 *)(&pZVar54->litlen + 2);
      pZVar1 = pZVar17 + uVar6;
      pZVar1->litlen = pZVar54->litlen;
      pZVar1->rep[0] = UVar23;
      *(undefined8 *)(&pZVar1->litlen + 2) = uVar3;
      pZVar54 = pZVar17 + uVar6;
      pZVar54->price = iVar9;
      pZVar54->off = UVar8;
      pZVar54->mlen = UVar7;
      pZVar54->litlen = UVar10;
      uVar46 = (ulong)(uVar35 - uVar51);
      if (uVar51 > uVar35) {
        uVar46 = 0;
      }
      uVar33 = uVar6 - 1;
    } while (uVar51 <= uVar35 && uVar35 - uVar51 != 0);
    for (; uVar6 <= uVar28; uVar6 = uVar6 + 1) {
LAB_0012290b:
      uVar33 = local_158[uVar6].litlen;
      uVar46 = (ulong)uVar33;
      UVar23 = local_158[uVar6].mlen;
      if (UVar23 == 0) {
        puVar30 = (ulong *)(uVar46 + (long)puVar31);
      }
      else {
        uVar35 = local_158[uVar6].off;
        if (uVar35 < 3) {
          uVar51 = (uVar46 == 0) + uVar35;
          if (uVar51 != 0) {
            if (uVar51 == 3) {
              UVar8 = *pUVar18 - 1;
LAB_00122975:
              pUVar18[2] = pUVar18[1];
            }
            else {
              UVar8 = pUVar18[uVar51];
              if (uVar51 != 1) goto LAB_00122975;
            }
            pUVar18[1] = *pUVar18;
            goto LAB_00122985;
          }
        }
        else {
          *(undefined8 *)(pUVar18 + 1) = *(undefined8 *)pUVar18;
          UVar8 = uVar35 - 2;
LAB_00122985:
          *pUVar18 = UVar8;
        }
        ZSTD_updateStats(poVar37,uVar33,(BYTE *)puVar31,uVar35,UVar23);
        puVar30 = (ulong *)local_98->lit;
        puVar38 = (ulong *)((long)puVar30 + uVar46);
        puVar29 = puVar31;
        do {
          *puVar30 = *puVar29;
          puVar30 = puVar30 + 1;
          puVar29 = puVar29 + 1;
        } while (puVar30 < puVar38);
        local_98->lit = local_98->lit + uVar46;
        if (uVar33 < 0x10000) {
          psVar19 = local_98->sequences;
        }
        else {
          local_98->longLengthID = 1;
          psVar19 = local_98->sequences;
          local_98->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)local_98->sequencesStart) >> 3);
        }
        psVar19->litLength = (U16)uVar33;
        psVar19->offset = uVar35 + 1;
        if (0xffff < UVar23 - 3) {
          local_98->longLengthID = 2;
          local_98->longLengthPos =
               (U32)((ulong)((long)psVar19 - (long)local_98->sequencesStart) >> 3);
        }
        psVar19->matchLength = (U16)(UVar23 - 3);
        local_98->sequences = psVar19 + 1;
        puVar31 = (ulong *)((long)puVar31 + (ulong)(UVar23 + uVar33));
        poVar37 = local_f0;
        pUVar18 = local_e0;
        puVar30 = puVar31;
      }
    }
    ZSTD_setBasePrices(poVar37,2);
  }
  if (local_a0 <= puVar30) goto LAB_00122c25;
  goto LAB_0011f5e4;
LAB_00121d3c:
  local_1c0 = (uint *)&local_140;
  goto LAB_001213b3;
LAB_00121d49:
  local_1c8 = (uint *)&local_140;
LAB_001213b3:
  *local_1c0 = 0;
  *local_1c8 = 0;
LAB_0012163c:
  ms->nextToUpdate = iVar65 - 8;
  puVar31 = local_130;
LAB_00121658:
  auVar61 = _local_c8;
  pZVar17 = local_158;
  if (uVar52 != 0) {
    uVar6 = pZVar2[uVar52 - 1].len;
    if (((uint)local_108 < uVar6) || (0xfff < uVar6 + iVar9)) {
      UVar8 = 0;
      if (pZVar1->mlen == 0) {
        UVar8 = pZVar1->litlen;
      }
      UVar7 = pZVar2[uVar52 - 1].off;
      pUVar18 = local_e0;
      uVar33 = iVar9 - UVar8;
      if (0x1000 < iVar9 - UVar8) {
        uVar33 = 0;
      }
      goto LAB_001203e6;
    }
    local_c8._1_3_ = local_c8._1_3_;
    local_c8[0] = (undefined1)local_a8;
    stack0xffffffffffffff3c = auVar61._4_12_;
    lVar14 = (long)local_d8 + (long)local_158;
    uVar57 = 0;
    do {
      UVar8 = pZVar2[uVar57].off;
      rVar72 = ZSTD_updateRep((U32 *)(lVar14 + 0x10),UVar8,local_c8._0_4_);
      uVar6 = uVar59;
      if (uVar57 != 0) {
        uVar6 = pZVar2[uVar57 - 1].len + 1;
      }
      uVar33 = pZVar2[uVar57].len;
      if (uVar6 <= uVar33) {
        uVar28 = 0x1f;
        if (UVar8 + 1 != 0) {
          for (; UVar8 + 1 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        do {
          if ((ms->opt).priceType == zop_predef) {
            uVar35 = uVar33 - 2;
            iVar65 = 0x1f;
            if (uVar35 != 0) {
              for (; uVar35 >> iVar65 == 0; iVar65 = iVar65 + -1) {
              }
            }
            iVar65 = (iVar65 + uVar28) * 0x100 + (uVar35 * 0x100 >> ((byte)iVar65 & 0x1f)) + 0x1000;
          }
          else {
            uVar51 = uVar33 - 3;
            uVar35 = (ms->opt).offCodeFreq[uVar28] + 1;
            iVar65 = 0x1f;
            if (uVar35 != 0) {
              for (; uVar35 >> iVar65 == 0; iVar65 = iVar65 + -1) {
              }
            }
            if (uVar51 < 0x80) {
              uVar51 = (uint)(byte)ZSTD_MLcode_ML_Code[uVar51];
            }
            else {
              uVar44 = 0x1f;
              if (uVar51 != 0) {
                for (; uVar51 >> uVar44 == 0; uVar44 = uVar44 - 1) {
                }
              }
              uVar51 = (uVar44 ^ 0xffffffe0) + 0x44;
            }
            uVar44 = (ms->opt).matchLengthFreq[uVar51] + 1;
            iVar66 = 0x1f;
            if (uVar44 != 0) {
              for (; uVar44 >> iVar66 == 0; iVar66 = iVar66 + -1) {
              }
            }
            iVar65 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar35 * 0x100 >> ((byte)iVar65 & 0x1f)) +
                     (uVar44 * 0x100 >> ((byte)iVar66 & 0x1f)))) +
                     ((ML_bits[uVar51] + uVar28) - (iVar65 + iVar66)) * 0x100 + 0x33;
            pZVar17 = local_158;
          }
          iVar65 = iVar65 + UVar7 + iVar64;
          uVar53 = (ulong)(uVar33 + iVar9);
          if ((uint)uVar46 < uVar33 + iVar9) {
            uVar46 = uVar46 & 0xffffffff;
            pZVar54 = local_78 + uVar46;
            do {
              uVar46 = uVar46 + 1;
              pZVar54->price = 0x40000000;
              pZVar54 = pZVar54 + 1;
            } while (uVar46 < uVar53);
LAB_00121847:
            pZVar17[uVar53].mlen = uVar33;
            pZVar17[uVar53].off = UVar8;
            pZVar17[uVar53].litlen = UVar23;
            pZVar17[uVar53].price = iVar65;
            *(long *)pZVar17[uVar53].rep = rVar72.rep._0_8_;
            pZVar17[uVar53].rep[2] = rVar72.rep[2];
          }
          else if (iVar65 < pZVar17[uVar53].price) goto LAB_00121847;
          uVar33 = uVar33 - 1;
        } while (uVar6 <= uVar33);
      }
      uVar57 = uVar57 + 1;
    } while (uVar57 != uVar52);
  }
LAB_0012189d:
  uVar53 = uVar46;
  uVar57 = (ulong)(iVar9 + 1U);
  if ((uint)uVar46 < iVar9 + 1U) goto LAB_001227e9;
  goto LAB_001206c7;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}